

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Occluded1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  uint uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [32];
  Primitive PVar8;
  Geometry *pGVar9;
  code *pcVar10;
  RTCFilterFunctionN p_Var11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  ulong uVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [12];
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined8 uVar71;
  undefined8 uVar72;
  undefined1 auVar73 [32];
  undefined1 auVar74 [28];
  undefined1 auVar75 [32];
  undefined1 auVar76 [24];
  int iVar77;
  undefined4 uVar78;
  ulong uVar79;
  Geometry *pGVar80;
  RTCIntersectArguments *pRVar81;
  ulong uVar82;
  uint uVar83;
  ulong uVar84;
  ulong uVar85;
  long lVar86;
  long lVar87;
  undefined8 uVar88;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar106;
  float fVar108;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar123;
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  float fVar140;
  float fVar144;
  vint4 ai_2;
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  vint4 ai;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar178;
  float fVar187;
  float fVar188;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar182 [32];
  float fVar189;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar193 [16];
  undefined1 auVar199 [64];
  undefined4 uVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [64];
  float fVar203;
  undefined1 auVar204 [16];
  undefined8 uVar207;
  undefined8 uVar208;
  undefined8 uVar209;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  RTCFilterFunctionNArguments args;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  long local_610;
  ulong local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  undefined8 uStack_558;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  int local_320;
  int local_31c;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2a0 [4];
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined1 local_260 [32];
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar79 = (ulong)(byte)PVar8;
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar150 = vsubps_avx(auVar150,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar125 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar89._0_4_ = fVar125 * auVar150._0_4_;
  auVar89._4_4_ = fVar125 * auVar150._4_4_;
  auVar89._8_4_ = fVar125 * auVar150._8_4_;
  auVar89._12_4_ = fVar125 * auVar150._12_4_;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar161._0_4_ = fVar125 * auVar12._0_4_;
  auVar161._4_4_ = fVar125 * auVar12._4_4_;
  auVar161._8_4_ = fVar125 * auVar12._8_4_;
  auVar161._12_4_ = fVar125 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xc + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xd + 6)));
  auVar147 = vcvtdq2ps_avx(auVar147);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x12 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x13 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar113 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x14 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar212._4_4_ = auVar161._0_4_;
  auVar212._0_4_ = auVar161._0_4_;
  auVar212._8_4_ = auVar161._0_4_;
  auVar212._12_4_ = auVar161._0_4_;
  auVar126 = vshufps_avx(auVar161,auVar161,0x55);
  auVar90 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar125 = auVar90._0_4_;
  auVar193._0_4_ = fVar125 * auVar13._0_4_;
  fVar124 = auVar90._4_4_;
  auVar193._4_4_ = fVar124 * auVar13._4_4_;
  fVar106 = auVar90._8_4_;
  auVar193._8_4_ = fVar106 * auVar13._8_4_;
  fVar107 = auVar90._12_4_;
  auVar193._12_4_ = fVar107 * auVar13._12_4_;
  auVar179._0_4_ = auVar15._0_4_ * fVar125;
  auVar179._4_4_ = auVar15._4_4_ * fVar124;
  auVar179._8_4_ = auVar15._8_4_ * fVar106;
  auVar179._12_4_ = auVar15._12_4_ * fVar107;
  auVar174._0_4_ = auVar113._0_4_ * fVar125;
  auVar174._4_4_ = auVar113._4_4_ * fVar124;
  auVar174._8_4_ = auVar113._8_4_ * fVar106;
  auVar174._12_4_ = auVar113._12_4_ * fVar107;
  auVar90 = vfmadd231ps_fma(auVar193,auVar126,auVar12);
  auVar114 = vfmadd231ps_fma(auVar179,auVar126,auVar147);
  auVar126 = vfmadd231ps_fma(auVar174,auVar91,auVar126);
  auVar141 = vfmadd231ps_fma(auVar90,auVar212,auVar150);
  auVar199 = ZEXT1664(auVar141);
  auVar114 = vfmadd231ps_fma(auVar114,auVar212,auVar14);
  auVar145 = vfmadd231ps_fma(auVar126,auVar92,auVar212);
  auVar213._4_4_ = auVar89._0_4_;
  auVar213._0_4_ = auVar89._0_4_;
  auVar213._8_4_ = auVar89._0_4_;
  auVar213._12_4_ = auVar89._0_4_;
  auVar126 = vshufps_avx(auVar89,auVar89,0x55);
  auVar90 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar125 = auVar90._0_4_;
  auVar162._0_4_ = fVar125 * auVar13._0_4_;
  fVar124 = auVar90._4_4_;
  auVar162._4_4_ = fVar124 * auVar13._4_4_;
  fVar106 = auVar90._8_4_;
  auVar162._8_4_ = fVar106 * auVar13._8_4_;
  fVar107 = auVar90._12_4_;
  auVar162._12_4_ = fVar107 * auVar13._12_4_;
  auVar112._0_4_ = auVar15._0_4_ * fVar125;
  auVar112._4_4_ = auVar15._4_4_ * fVar124;
  auVar112._8_4_ = auVar15._8_4_ * fVar106;
  auVar112._12_4_ = auVar15._12_4_ * fVar107;
  auVar90._0_4_ = auVar113._0_4_ * fVar125;
  auVar90._4_4_ = auVar113._4_4_ * fVar124;
  auVar90._8_4_ = auVar113._8_4_ * fVar106;
  auVar90._12_4_ = auVar113._12_4_ * fVar107;
  auVar12 = vfmadd231ps_fma(auVar162,auVar126,auVar12);
  auVar13 = vfmadd231ps_fma(auVar112,auVar126,auVar147);
  auVar147 = vfmadd231ps_fma(auVar90,auVar126,auVar91);
  auVar91 = vfmadd231ps_fma(auVar12,auVar213,auVar150);
  auVar113 = vfmadd231ps_fma(auVar13,auVar213,auVar14);
  local_410._8_4_ = 0x7fffffff;
  local_410._0_8_ = 0x7fffffff7fffffff;
  local_410._12_4_ = 0x7fffffff;
  auVar202 = ZEXT1664(local_410);
  auVar150 = vandps_avx(auVar141,local_410);
  auVar168._8_4_ = 0x219392ef;
  auVar168._0_8_ = 0x219392ef219392ef;
  auVar168._12_4_ = 0x219392ef;
  auVar150 = vcmpps_avx(auVar150,auVar168,1);
  auVar12 = vblendvps_avx(auVar141,auVar168,auVar150);
  auVar150 = vandps_avx(auVar114,local_410);
  auVar150 = vcmpps_avx(auVar150,auVar168,1);
  auVar13 = vblendvps_avx(auVar114,auVar168,auVar150);
  auVar150 = vandps_avx(auVar145,local_410);
  auVar150 = vcmpps_avx(auVar150,auVar168,1);
  auVar150 = vblendvps_avx(auVar145,auVar168,auVar150);
  auVar126 = vfmadd231ps_fma(auVar147,auVar213,auVar92);
  auVar14 = vrcpps_avx(auVar12);
  auVar169._8_4_ = 0x3f800000;
  auVar169._0_8_ = 0x3f8000003f800000;
  auVar169._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar169);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar169);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar150);
  auVar150 = vfnmadd213ps_fma(auVar150,auVar12,auVar169);
  auVar92 = vfmadd132ps_fma(auVar150,auVar12,auVar12);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar91);
  auVar145._0_4_ = auVar14._0_4_ * auVar150._0_4_;
  auVar145._4_4_ = auVar14._4_4_ * auVar150._4_4_;
  auVar145._8_4_ = auVar14._8_4_ * auVar150._8_4_;
  auVar145._12_4_ = auVar14._12_4_ * auVar150._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar150 = vpmovsxwd_avx(auVar12);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar91);
  auVar155._0_4_ = auVar14._0_4_ * auVar150._0_4_;
  auVar155._4_4_ = auVar14._4_4_ * auVar150._4_4_;
  auVar155._8_4_ = auVar14._8_4_ * auVar150._8_4_;
  auVar155._12_4_ = auVar14._12_4_ * auVar150._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar79 * 0xe + 6);
  auVar150 = vpmovsxwd_avx(auVar13);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar113);
  auVar163._0_4_ = auVar15._0_4_ * auVar150._0_4_;
  auVar163._4_4_ = auVar15._4_4_ * auVar150._4_4_;
  auVar163._8_4_ = auVar15._8_4_ * auVar150._8_4_;
  auVar163._12_4_ = auVar15._12_4_ * auVar150._12_4_;
  auVar114._1_3_ = 0;
  auVar114[0] = PVar8;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar150 = vpmovsxwd_avx(auVar14);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar12 = vsubps_avx(auVar150,auVar113);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar79 * 0x15 + 6);
  auVar150 = vpmovsxwd_avx(auVar147);
  auVar113._0_4_ = auVar15._0_4_ * auVar12._0_4_;
  auVar113._4_4_ = auVar15._4_4_ * auVar12._4_4_;
  auVar113._8_4_ = auVar15._8_4_ * auVar12._8_4_;
  auVar113._12_4_ = auVar15._12_4_ * auVar12._12_4_;
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar126);
  auVar141._0_4_ = auVar92._0_4_ * auVar150._0_4_;
  auVar141._4_4_ = auVar92._4_4_ * auVar150._4_4_;
  auVar141._8_4_ = auVar92._8_4_ * auVar150._8_4_;
  auVar141._12_4_ = auVar92._12_4_ * auVar150._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar150 = vpmovsxwd_avx(auVar15);
  auVar150 = vcvtdq2ps_avx(auVar150);
  auVar150 = vsubps_avx(auVar150,auVar126);
  auVar91._0_4_ = auVar92._0_4_ * auVar150._0_4_;
  auVar91._4_4_ = auVar92._4_4_ * auVar150._4_4_;
  auVar91._8_4_ = auVar92._8_4_ * auVar150._8_4_;
  auVar91._12_4_ = auVar92._12_4_ * auVar150._12_4_;
  auVar150 = vpminsd_avx(auVar145,auVar155);
  auVar12 = vpminsd_avx(auVar163,auVar113);
  auVar150 = vmaxps_avx(auVar150,auVar12);
  auVar12 = vpminsd_avx(auVar141,auVar91);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar180._4_4_ = uVar78;
  auVar180._0_4_ = uVar78;
  auVar180._8_4_ = uVar78;
  auVar180._12_4_ = uVar78;
  auVar12 = vmaxps_avx(auVar12,auVar180);
  auVar150 = vmaxps_avx(auVar150,auVar12);
  local_420._0_4_ = auVar150._0_4_ * 0.99999964;
  local_420._4_4_ = auVar150._4_4_ * 0.99999964;
  local_420._8_4_ = auVar150._8_4_ * 0.99999964;
  local_420._12_4_ = auVar150._12_4_ * 0.99999964;
  auVar150 = vpmaxsd_avx(auVar145,auVar155);
  auVar12 = vpmaxsd_avx(auVar163,auVar113);
  auVar150 = vminps_avx(auVar150,auVar12);
  auVar12 = vpmaxsd_avx(auVar141,auVar91);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar126._4_4_ = uVar78;
  auVar126._0_4_ = uVar78;
  auVar126._8_4_ = uVar78;
  auVar126._12_4_ = uVar78;
  auVar12 = vminps_avx(auVar12,auVar126);
  auVar150 = vminps_avx(auVar150,auVar12);
  auVar92._0_4_ = auVar150._0_4_ * 1.0000004;
  auVar92._4_4_ = auVar150._4_4_ * 1.0000004;
  auVar92._8_4_ = auVar150._8_4_ * 1.0000004;
  auVar92._12_4_ = auVar150._12_4_ * 1.0000004;
  auVar114[4] = PVar8;
  auVar114._5_3_ = 0;
  auVar114[8] = PVar8;
  auVar114._9_3_ = 0;
  auVar114[0xc] = PVar8;
  auVar114._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar114,_DAT_01f4ad30);
  auVar150 = vcmpps_avx(local_420,auVar92,2);
  auVar150 = vandps_avx(auVar150,auVar12);
  uVar83 = vmovmskps_avx(auVar150);
  local_600 = mm_lookupmask_ps._16_8_;
  uStack_5f8 = mm_lookupmask_ps._24_8_;
  uStack_5f0 = mm_lookupmask_ps._16_8_;
  uStack_5e8 = mm_lookupmask_ps._24_8_;
  iVar77 = 1 << ((uint)k & 0x1f);
  auVar96._4_4_ = iVar77;
  auVar96._0_4_ = iVar77;
  auVar96._8_4_ = iVar77;
  auVar96._12_4_ = iVar77;
  auVar96._16_4_ = iVar77;
  auVar96._20_4_ = iVar77;
  auVar96._24_4_ = iVar77;
  auVar96._28_4_ = iVar77;
  auVar197 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar96 = vpand_avx2(auVar96,auVar197);
  local_400 = vpcmpeqd_avx2(auVar96,auVar197);
  for (; local_608 = (ulong)uVar83, local_608 != 0; uVar83 = (uint)uVar85 & uVar83) {
    local_6a0 = auVar199._0_32_;
    lVar87 = 0;
    for (uVar82 = local_608; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      lVar87 = lVar87 + 1;
    }
    uVar85 = local_608 - 1 & local_608;
    local_660._4_4_ = *(undefined4 *)(prim + lVar87 * 4 + 6);
    uVar82 = (ulong)(uint)((int)lVar87 << 6);
    uVar83 = *(uint *)(prim + 2);
    pGVar9 = (context->scene->geometries).items[uVar83].ptr;
    pPVar1 = prim + uVar82 + uVar79 * 0x19 + 0x16;
    uVar71 = *(undefined8 *)pPVar1;
    uVar72 = *(undefined8 *)(pPVar1 + 8);
    auVar12 = *(undefined1 (*) [16])pPVar1;
    auVar150 = *(undefined1 (*) [16])pPVar1;
    if (uVar85 != 0) {
      uVar84 = uVar85 - 1 & uVar85;
      for (uVar18 = uVar85; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
      }
      if (uVar84 != 0) {
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar13 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x26);
    auVar14 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x36);
    _local_620 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x46);
    auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                             0x1c);
    iVar77 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar91 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
    auVar15 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar91);
    uVar78 = auVar15._0_4_;
    auVar146._4_4_ = uVar78;
    auVar146._0_4_ = uVar78;
    auVar146._8_4_ = uVar78;
    auVar146._12_4_ = uVar78;
    auVar147 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    aVar5 = pre->ray_space[k].vx.field_0;
    aVar6 = pre->ray_space[k].vy.field_0;
    fVar125 = pre->ray_space[k].vz.field_0.m128[0];
    fVar124 = pre->ray_space[k].vz.field_0.m128[1];
    fVar106 = pre->ray_space[k].vz.field_0.m128[2];
    fVar107 = pre->ray_space[k].vz.field_0.m128[3];
    auVar164._0_4_ = fVar125 * auVar15._0_4_;
    auVar164._4_4_ = fVar124 * auVar15._4_4_;
    auVar164._8_4_ = fVar106 * auVar15._8_4_;
    auVar164._12_4_ = fVar107 * auVar15._12_4_;
    auVar147 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar6,auVar147);
    auVar126 = vfmadd231ps_fma(auVar147,(undefined1  [16])aVar5,auVar146);
    auVar147 = vblendps_avx(auVar126,*(undefined1 (*) [16])pPVar1,8);
    auVar92 = vsubps_avx(auVar13,auVar91);
    uVar78 = auVar92._0_4_;
    auVar165._4_4_ = uVar78;
    auVar165._0_4_ = uVar78;
    auVar165._8_4_ = uVar78;
    auVar165._12_4_ = uVar78;
    auVar15 = vshufps_avx(auVar92,auVar92,0x55);
    auVar92 = vshufps_avx(auVar92,auVar92,0xaa);
    auVar181._0_4_ = fVar125 * auVar92._0_4_;
    auVar181._4_4_ = fVar124 * auVar92._4_4_;
    auVar181._8_4_ = fVar106 * auVar92._8_4_;
    auVar181._12_4_ = fVar107 * auVar92._12_4_;
    auVar15 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar15);
    auVar90 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar165);
    auVar15 = vblendps_avx(auVar90,auVar13,8);
    auVar113 = vsubps_avx(auVar14,auVar91);
    uVar78 = auVar113._0_4_;
    auVar170._4_4_ = uVar78;
    auVar170._0_4_ = uVar78;
    auVar170._8_4_ = uVar78;
    auVar170._12_4_ = uVar78;
    auVar92 = vshufps_avx(auVar113,auVar113,0x55);
    auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar201._0_4_ = fVar125 * auVar113._0_4_;
    auVar201._4_4_ = fVar124 * auVar113._4_4_;
    auVar201._8_4_ = fVar106 * auVar113._8_4_;
    auVar201._12_4_ = fVar107 * auVar113._12_4_;
    auVar92 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar92);
    auVar114 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar5,auVar170);
    auVar92 = vblendps_avx(auVar114,auVar14,8);
    auVar113 = vsubps_avx(_local_620,auVar91);
    uVar78 = auVar113._0_4_;
    auVar171._4_4_ = uVar78;
    auVar171._0_4_ = uVar78;
    auVar171._8_4_ = uVar78;
    auVar171._12_4_ = uVar78;
    auVar91 = vshufps_avx(auVar113,auVar113,0x55);
    auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar204._0_4_ = fVar125 * auVar113._0_4_;
    auVar204._4_4_ = fVar124 * auVar113._4_4_;
    auVar204._8_4_ = fVar106 * auVar113._8_4_;
    auVar204._12_4_ = fVar107 * auVar113._12_4_;
    auVar91 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar6,auVar91);
    auVar141 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar5,auVar171);
    auVar91 = vblendps_avx(auVar141,_local_620,8);
    auVar147 = vandps_avx(auVar147,local_410);
    auVar15 = vandps_avx(auVar15,local_410);
    auVar113 = vmaxps_avx(auVar147,auVar15);
    auVar147 = vandps_avx(auVar92,local_410);
    auVar15 = vandps_avx(auVar91,local_410);
    auVar147 = vmaxps_avx(auVar147,auVar15);
    auVar147 = vmaxps_avx(auVar113,auVar147);
    auVar15 = vmovshdup_avx(auVar147);
    auVar15 = vmaxss_avx(auVar15,auVar147);
    auVar147 = vshufpd_avx(auVar147,auVar147,1);
    auVar147 = vmaxss_avx(auVar147,auVar15);
    local_610 = (long)iVar77;
    lVar87 = local_610 * 0x44;
    auVar15 = vmovshdup_avx(auVar126);
    uVar88 = auVar15._0_8_;
    local_5c0._8_8_ = uVar88;
    local_5c0._0_8_ = uVar88;
    local_5c0._16_8_ = uVar88;
    local_5c0._24_8_ = uVar88;
    auVar15 = vmovshdup_avx(auVar90);
    uVar88 = auVar15._0_8_;
    local_440._8_8_ = uVar88;
    local_440._0_8_ = uVar88;
    local_440._16_8_ = uVar88;
    local_440._24_8_ = uVar88;
    auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x908);
    uVar200 = auVar114._0_4_;
    auVar132._4_4_ = uVar200;
    auVar132._0_4_ = uVar200;
    auVar132._8_4_ = uVar200;
    auVar132._12_4_ = uVar200;
    auVar132._16_4_ = uVar200;
    auVar132._20_4_ = uVar200;
    auVar132._24_4_ = uVar200;
    auVar132._28_4_ = uVar200;
    auVar15 = vmovshdup_avx(auVar114);
    uVar88 = auVar15._0_8_;
    auVar182._8_8_ = uVar88;
    auVar182._0_8_ = uVar88;
    auVar182._16_8_ = uVar88;
    auVar182._24_8_ = uVar88;
    fVar125 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar87 + 0xd8c);
    auVar74 = *(undefined1 (*) [28])(bspline_basis0 + lVar87 + 0xd8c);
    fVar203 = auVar141._0_4_;
    auVar15 = vmovshdup_avx(auVar141);
    auVar197._4_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xd90);
    auVar197._0_4_ = fVar203 * fVar125;
    auVar197._8_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xd94);
    auVar197._12_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xd98);
    auVar197._16_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xd9c);
    auVar197._20_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xda0);
    auVar197._24_4_ = fVar203 * *(float *)(bspline_basis0 + lVar87 + 0xda4);
    auVar197._28_4_ = *(undefined4 *)(bspline_basis0 + lVar87 + 0xda8);
    auVar92 = vfmadd231ps_fma(auVar197,auVar96,auVar132);
    fVar140 = auVar15._0_4_;
    auVar160._0_4_ = fVar140 * fVar125;
    fVar144 = auVar15._4_4_;
    auVar160._4_4_ = fVar144 * *(float *)(bspline_basis0 + lVar87 + 0xd90);
    auVar160._8_4_ = fVar140 * *(float *)(bspline_basis0 + lVar87 + 0xd94);
    auVar160._12_4_ = fVar144 * *(float *)(bspline_basis0 + lVar87 + 0xd98);
    auVar160._16_4_ = fVar140 * *(float *)(bspline_basis0 + lVar87 + 0xd9c);
    auVar160._20_4_ = fVar144 * *(float *)(bspline_basis0 + lVar87 + 0xda0);
    auVar160._24_4_ = fVar140 * *(float *)(bspline_basis0 + lVar87 + 0xda4);
    auVar160._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar160,auVar96,auVar182);
    auVar197 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x484);
    uVar78 = auVar90._0_4_;
    auVar194._4_4_ = uVar78;
    auVar194._0_4_ = uVar78;
    auVar194._8_4_ = uVar78;
    auVar194._12_4_ = uVar78;
    auVar194._16_4_ = uVar78;
    auVar194._20_4_ = uVar78;
    auVar194._24_4_ = uVar78;
    auVar194._28_4_ = uVar78;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar197,auVar194);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar197,local_440);
    auVar160 = *(undefined1 (*) [32])(bspline_basis0 + lVar87);
    local_580._0_4_ = auVar126._0_4_;
    auVar214._4_4_ = local_580._0_4_;
    auVar214._0_4_ = local_580._0_4_;
    auVar214._8_4_ = local_580._0_4_;
    auVar214._12_4_ = local_580._0_4_;
    auVar214._16_4_ = local_580._0_4_;
    auVar214._20_4_ = local_580._0_4_;
    auVar214._24_4_ = local_580._0_4_;
    auVar214._28_4_ = local_580._0_4_;
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar160,auVar214);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar160,local_5c0);
    auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x908);
    fVar124 = *(float *)(bspline_basis1 + lVar87 + 0xd8c);
    fVar106 = *(float *)(bspline_basis1 + lVar87 + 0xd90);
    fVar107 = *(float *)(bspline_basis1 + lVar87 + 0xd94);
    fVar108 = *(float *)(bspline_basis1 + lVar87 + 0xd98);
    fVar109 = *(float *)(bspline_basis1 + lVar87 + 0xd9c);
    fVar110 = *(float *)(bspline_basis1 + lVar87 + 0xda0);
    fVar111 = *(float *)(bspline_basis1 + lVar87 + 0xda4);
    auVar119._4_4_ = fVar203 * fVar106;
    auVar119._0_4_ = fVar203 * fVar124;
    auVar119._8_4_ = fVar203 * fVar107;
    auVar119._12_4_ = fVar203 * fVar108;
    auVar119._16_4_ = fVar203 * fVar109;
    auVar119._20_4_ = fVar203 * fVar110;
    auVar119._24_4_ = fVar203 * fVar111;
    auVar119._28_4_ = *(undefined4 *)(bspline_basis0 + lVar87 + 0xda8);
    auVar91 = vfmadd231ps_fma(auVar119,auVar103,auVar132);
    auVar7._4_4_ = fVar144 * fVar106;
    auVar7._0_4_ = fVar140 * fVar124;
    auVar7._8_4_ = fVar140 * fVar107;
    auVar7._12_4_ = fVar144 * fVar108;
    auVar7._16_4_ = fVar140 * fVar109;
    auVar7._20_4_ = fVar144 * fVar110;
    auVar7._24_4_ = fVar140 * fVar111;
    auVar7._28_4_ = uVar200;
    auVar113 = vfmadd231ps_fma(auVar7,auVar103,auVar182);
    auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x484);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar119,auVar194);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar119,local_440);
    auVar7 = *(undefined1 (*) [32])(bspline_basis1 + lVar87);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar7,auVar214);
    auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar7,local_5c0);
    _local_480 = ZEXT1632(auVar91);
    local_460 = ZEXT1632(auVar92);
    auVar105 = vsubps_avx(_local_480,local_460);
    local_4a0 = ZEXT1632(auVar113);
    local_4c0 = ZEXT1632(auVar15);
    local_4e0 = vsubps_avx(local_4a0,local_4c0);
    auVar97._0_4_ = auVar15._0_4_ * auVar105._0_4_;
    auVar97._4_4_ = auVar15._4_4_ * auVar105._4_4_;
    auVar97._8_4_ = auVar15._8_4_ * auVar105._8_4_;
    auVar97._12_4_ = auVar15._12_4_ * auVar105._12_4_;
    auVar97._16_4_ = auVar105._16_4_ * 0.0;
    auVar97._20_4_ = auVar105._20_4_ * 0.0;
    auVar97._24_4_ = auVar105._24_4_ * 0.0;
    auVar97._28_4_ = 0;
    fVar178 = local_4e0._0_4_;
    auVar115._0_4_ = fVar178 * auVar92._0_4_;
    fVar187 = local_4e0._4_4_;
    auVar115._4_4_ = fVar187 * auVar92._4_4_;
    fVar188 = local_4e0._8_4_;
    auVar115._8_4_ = fVar188 * auVar92._8_4_;
    fVar189 = local_4e0._12_4_;
    auVar115._12_4_ = fVar189 * auVar92._12_4_;
    fVar190 = local_4e0._16_4_;
    auVar115._16_4_ = fVar190 * 0.0;
    fVar191 = local_4e0._20_4_;
    auVar115._20_4_ = fVar191 * 0.0;
    fVar192 = local_4e0._24_4_;
    auVar115._24_4_ = fVar192 * 0.0;
    auVar115._28_4_ = 0;
    auVar97 = vsubps_avx(auVar97,auVar115);
    auVar15 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar88 = auVar15._0_8_;
    local_80._8_8_ = uVar88;
    local_80._0_8_ = uVar88;
    local_80._16_8_ = uVar88;
    local_80._24_8_ = uVar88;
    auVar92 = vpermilps_avx(auVar13,0xff);
    uVar88 = auVar92._0_8_;
    local_a0._8_8_ = uVar88;
    local_a0._0_8_ = uVar88;
    local_a0._16_8_ = uVar88;
    local_a0._24_8_ = uVar88;
    auVar92 = vpermilps_avx(auVar14,0xff);
    uVar88 = auVar92._0_8_;
    local_c0._8_8_ = uVar88;
    local_c0._0_8_ = uVar88;
    local_c0._16_8_ = uVar88;
    local_c0._24_8_ = uVar88;
    auVar92 = vpermilps_avx(_local_620,0xff);
    local_e0 = auVar92._0_8_;
    local_8e0 = auVar74._0_4_;
    fStack_8dc = auVar74._4_4_;
    fStack_8d8 = auVar74._8_4_;
    fStack_8d4 = auVar74._12_4_;
    fStack_8d0 = auVar74._16_4_;
    fStack_8cc = auVar74._20_4_;
    fStack_8c8 = auVar74._24_4_;
    fVar125 = auVar92._0_4_;
    fVar123 = auVar92._4_4_;
    auVar156._4_4_ = fVar123 * fStack_8dc;
    auVar156._0_4_ = fVar125 * local_8e0;
    auVar156._8_4_ = fVar125 * fStack_8d8;
    auVar156._12_4_ = fVar123 * fStack_8d4;
    auVar156._16_4_ = fVar125 * fStack_8d0;
    auVar156._20_4_ = fVar123 * fStack_8cc;
    auVar156._24_4_ = fVar125 * fStack_8c8;
    auVar156._28_4_ = local_580._0_4_;
    auVar92 = vfmadd231ps_fma(auVar156,local_c0,auVar96);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar197,local_a0);
    auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar160,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar136._4_4_ = fVar123 * fVar106;
    auVar136._0_4_ = fVar125 * fVar124;
    auVar136._8_4_ = fVar125 * fVar107;
    auVar136._12_4_ = fVar123 * fVar108;
    auVar136._16_4_ = fVar125 * fVar109;
    auVar136._20_4_ = fVar123 * fVar110;
    auVar136._24_4_ = fVar125 * fVar111;
    auVar136._28_4_ = auVar160._28_4_;
    auVar91 = vfmadd231ps_fma(auVar136,auVar103,local_c0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar119,local_a0);
    auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar7,local_80);
    auVar198._4_4_ = fVar187 * fVar187;
    auVar198._0_4_ = fVar178 * fVar178;
    auVar198._8_4_ = fVar188 * fVar188;
    auVar198._12_4_ = fVar189 * fVar189;
    auVar198._16_4_ = fVar190 * fVar190;
    auVar198._20_4_ = fVar191 * fVar191;
    auVar198._24_4_ = fVar192 * fVar192;
    auVar198._28_4_ = auVar15._4_4_;
    auVar15 = vfmadd231ps_fma(auVar198,auVar105,auVar105);
    auVar156 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar91));
    auVar211._4_4_ = auVar156._4_4_ * auVar156._4_4_ * auVar15._4_4_;
    auVar211._0_4_ = auVar156._0_4_ * auVar156._0_4_ * auVar15._0_4_;
    auVar211._8_4_ = auVar156._8_4_ * auVar156._8_4_ * auVar15._8_4_;
    auVar211._12_4_ = auVar156._12_4_ * auVar156._12_4_ * auVar15._12_4_;
    auVar211._16_4_ = auVar156._16_4_ * auVar156._16_4_ * 0.0;
    auVar211._20_4_ = auVar156._20_4_ * auVar156._20_4_ * 0.0;
    auVar211._24_4_ = auVar156._24_4_ * auVar156._24_4_ * 0.0;
    auVar211._28_4_ = auVar156._28_4_;
    auVar17._4_4_ = auVar97._4_4_ * auVar97._4_4_;
    auVar17._0_4_ = auVar97._0_4_ * auVar97._0_4_;
    auVar17._8_4_ = auVar97._8_4_ * auVar97._8_4_;
    auVar17._12_4_ = auVar97._12_4_ * auVar97._12_4_;
    auVar17._16_4_ = auVar97._16_4_ * auVar97._16_4_;
    auVar17._20_4_ = auVar97._20_4_ * auVar97._20_4_;
    auVar17._24_4_ = auVar97._24_4_ * auVar97._24_4_;
    auVar17._28_4_ = auVar97._28_4_;
    auVar156 = vcmpps_avx(auVar17,auVar211,2);
    fVar125 = auVar147._0_4_ * 4.7683716e-07;
    auVar98._0_4_ = (float)iVar77;
    register0x00001504 = auVar141._4_12_;
    auVar98._4_4_ = auVar98._0_4_;
    auVar98._8_4_ = auVar98._0_4_;
    auVar98._12_4_ = auVar98._0_4_;
    auVar98._16_4_ = auVar98._0_4_;
    auVar98._20_4_ = auVar98._0_4_;
    auVar98._24_4_ = auVar98._0_4_;
    auVar98._28_4_ = auVar98._0_4_;
    auVar97 = vcmpps_avx(_DAT_01f7b060,auVar98,1);
    auVar15 = vpermilps_avx(auVar126,0xaa);
    uVar88 = auVar15._0_8_;
    auVar210._8_8_ = uVar88;
    auVar210._0_8_ = uVar88;
    auVar210._16_8_ = uVar88;
    auVar210._24_8_ = uVar88;
    auVar147 = vpermilps_avx(auVar90,0xaa);
    uVar88 = auVar147._0_8_;
    local_3a0._8_8_ = uVar88;
    local_3a0._0_8_ = uVar88;
    local_3a0._16_8_ = uVar88;
    local_3a0._24_8_ = uVar88;
    auVar147 = vpermilps_avx(auVar114,0xaa);
    uVar88 = auVar147._0_8_;
    local_580._8_8_ = uVar88;
    local_580._0_8_ = uVar88;
    local_580._16_8_ = uVar88;
    local_580._24_8_ = uVar88;
    auVar147 = vshufps_avx(auVar141,auVar141,0xaa);
    uVar88 = auVar147._0_8_;
    auVar136 = auVar97 & auVar156;
    uVar4 = *(uint *)(ray + k * 4 + 0x60);
    local_6c0._0_16_ = ZEXT416(uVar4);
    local_5a0._0_16_ = ZEXT416((uint)local_660._4_4_);
    local_730 = auVar13._0_8_;
    uStack_728 = auVar13._8_8_;
    local_740 = auVar14._0_8_;
    uStack_738 = auVar14._8_8_;
    uStack_678 = uVar88;
    uStack_670 = uVar88;
    uStack_668 = uVar88;
    local_560._0_4_ = auVar98._0_4_;
    if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar136 >> 0x7f,0) == '\0') &&
          (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar136 >> 0xbf,0) == '\0') &&
        (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar136[0x1f])
    {
      uVar82 = 0;
      auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
    }
    else {
      local_5e0 = SUB84(pGVar9,0);
      uStack_5dc = (undefined4)((ulong)pGVar9 >> 0x20);
      _local_500 = vandps_avx(auVar156,auVar97);
      fVar123 = auVar147._0_4_;
      fVar178 = auVar147._4_4_;
      auVar121._4_4_ = fVar178 * fVar106;
      auVar121._0_4_ = fVar123 * fVar124;
      auVar121._8_4_ = fVar123 * fVar107;
      auVar121._12_4_ = fVar178 * fVar108;
      auVar121._16_4_ = fVar123 * fVar109;
      auVar121._20_4_ = fVar178 * fVar110;
      auVar121._24_4_ = fVar123 * fVar111;
      auVar121._28_4_ = local_500._28_4_;
      auVar147 = vfmadd213ps_fma(auVar103,local_580,auVar121);
      auVar147 = vfmadd213ps_fma(auVar119,local_3a0,ZEXT1632(auVar147));
      auVar147 = vfmadd213ps_fma(auVar7,auVar210,ZEXT1632(auVar147));
      auVar99._0_4_ = fVar123 * local_8e0;
      auVar99._4_4_ = fVar178 * fStack_8dc;
      auVar99._8_4_ = fVar123 * fStack_8d8;
      auVar99._12_4_ = fVar178 * fStack_8d4;
      auVar99._16_4_ = fVar123 * fStack_8d0;
      auVar99._20_4_ = fVar178 * fStack_8cc;
      auVar99._24_4_ = fVar123 * fStack_8c8;
      auVar99._28_4_ = 0;
      auVar113 = vfmadd213ps_fma(auVar96,local_580,auVar99);
      auVar113 = vfmadd213ps_fma(auVar197,local_3a0,ZEXT1632(auVar113));
      auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1210);
      auVar197 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(bspline_basis0 + lVar87 + 0x1b18);
      fVar124 = *(float *)(bspline_basis0 + lVar87 + 0x1f9c);
      fVar106 = *(float *)(bspline_basis0 + lVar87 + 0x1fa0);
      fVar107 = *(float *)(bspline_basis0 + lVar87 + 0x1fa4);
      fVar108 = *(float *)(bspline_basis0 + lVar87 + 0x1fa8);
      fVar109 = *(float *)(bspline_basis0 + lVar87 + 0x1fac);
      fVar110 = *(float *)(bspline_basis0 + lVar87 + 0x1fb0);
      fVar111 = *(float *)(bspline_basis0 + lVar87 + 0x1fb4);
      auVar16._4_4_ = fVar203 * fVar106;
      auVar16._0_4_ = fVar203 * fVar124;
      auVar16._8_4_ = fVar203 * fVar107;
      auVar16._12_4_ = fVar203 * fVar108;
      auVar16._16_4_ = fVar203 * fVar109;
      auVar16._20_4_ = fVar203 * fVar110;
      auVar16._24_4_ = fVar203 * fVar111;
      auVar16._28_4_ = *(undefined4 *)(bspline_basis1 + lVar87 + 0xda8);
      auVar175._0_4_ = fVar124 * fVar140;
      auVar175._4_4_ = fVar106 * fVar144;
      auVar175._8_4_ = fVar107 * fVar140;
      auVar175._12_4_ = fVar108 * fVar144;
      auVar175._16_4_ = fVar109 * fVar140;
      auVar175._20_4_ = fVar110 * fVar144;
      auVar175._24_4_ = fVar111 * fVar140;
      auVar175._28_4_ = 0;
      auVar172._4_4_ = fVar178 * fVar106;
      auVar172._0_4_ = fVar123 * fVar124;
      auVar172._8_4_ = fVar123 * fVar107;
      auVar172._12_4_ = fVar178 * fVar108;
      auVar172._16_4_ = fVar123 * fVar109;
      auVar172._20_4_ = fVar178 * fVar110;
      auVar172._24_4_ = fVar123 * fVar111;
      auVar172._28_4_ = auVar105._28_4_;
      auVar126 = vfmadd231ps_fma(auVar16,auVar103,auVar132);
      auVar90 = vfmadd231ps_fma(auVar175,auVar103,auVar182);
      auVar114 = vfmadd231ps_fma(auVar172,local_580,auVar103);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar197,auVar194);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar197,local_440);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),local_3a0,auVar197);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar96,auVar214);
      auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar96,local_5c0);
      auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar210,auVar96);
      fVar124 = *(float *)(bspline_basis1 + lVar87 + 0x1f9c);
      fVar106 = *(float *)(bspline_basis1 + lVar87 + 0x1fa0);
      fVar107 = *(float *)(bspline_basis1 + lVar87 + 0x1fa4);
      fVar108 = *(float *)(bspline_basis1 + lVar87 + 0x1fa8);
      fVar109 = *(float *)(bspline_basis1 + lVar87 + 0x1fac);
      fVar110 = *(float *)(bspline_basis1 + lVar87 + 0x1fb0);
      fVar111 = *(float *)(bspline_basis1 + lVar87 + 0x1fb4);
      auVar103._4_4_ = fVar203 * fVar106;
      auVar103._0_4_ = fVar203 * fVar124;
      auVar103._8_4_ = fVar203 * fVar107;
      auVar103._12_4_ = fVar203 * fVar108;
      auVar103._16_4_ = fVar203 * fVar109;
      auVar103._20_4_ = fVar203 * fVar110;
      auVar103._24_4_ = fVar203 * fVar111;
      auVar103._28_4_ = fVar203;
      auVar215._4_4_ = fVar144 * fVar106;
      auVar215._0_4_ = fVar140 * fVar124;
      auVar215._8_4_ = fVar140 * fVar107;
      auVar215._12_4_ = fVar144 * fVar108;
      auVar215._16_4_ = fVar140 * fVar109;
      auVar215._20_4_ = fVar144 * fVar110;
      auVar215._24_4_ = fVar140 * fVar111;
      auVar215._28_4_ = fVar178;
      auVar19._4_4_ = fVar178 * fVar106;
      auVar19._0_4_ = fVar123 * fVar124;
      auVar19._8_4_ = fVar123 * fVar107;
      auVar19._12_4_ = fVar178 * fVar108;
      auVar19._16_4_ = fVar123 * fVar109;
      auVar19._20_4_ = fVar178 * fVar110;
      auVar19._24_4_ = fVar123 * fVar111;
      auVar19._28_4_ = auVar15._4_4_;
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1b18);
      auVar15 = vfmadd231ps_fma(auVar103,auVar96,auVar132);
      auVar141 = vfmadd231ps_fma(auVar215,auVar96,auVar182);
      auVar145 = vfmadd231ps_fma(auVar19,auVar96,local_580);
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1694);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar96,auVar194);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar96,local_440);
      auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),local_3a0,auVar96);
      auVar96 = *(undefined1 (*) [32])(bspline_basis1 + lVar87 + 0x1210);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar96,auVar214);
      auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar96,local_5c0);
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116._16_4_ = 0x7fffffff;
      auVar116._20_4_ = 0x7fffffff;
      auVar116._24_4_ = 0x7fffffff;
      auVar116._28_4_ = 0x7fffffff;
      auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar210,auVar96);
      auVar96 = vandps_avx(ZEXT1632(auVar126),auVar116);
      auVar197 = vandps_avx(ZEXT1632(auVar90),auVar116);
      auVar197 = vmaxps_avx(auVar96,auVar197);
      auVar96 = vandps_avx(ZEXT1632(auVar114),auVar116);
      auVar96 = vmaxps_avx(auVar197,auVar96);
      auVar133._4_4_ = fVar125;
      auVar133._0_4_ = fVar125;
      auVar133._8_4_ = fVar125;
      auVar133._12_4_ = fVar125;
      auVar133._16_4_ = fVar125;
      auVar133._20_4_ = fVar125;
      auVar133._24_4_ = fVar125;
      auVar133._28_4_ = fVar125;
      auVar96 = vcmpps_avx(auVar96,auVar133,1);
      auVar103 = vblendvps_avx(ZEXT1632(auVar126),auVar105,auVar96);
      auVar119 = vblendvps_avx(ZEXT1632(auVar90),local_4e0,auVar96);
      auVar96 = vandps_avx(ZEXT1632(auVar15),auVar116);
      auVar197 = vandps_avx(ZEXT1632(auVar141),auVar116);
      auVar7 = vmaxps_avx(auVar96,auVar197);
      auVar96 = vandps_avx(ZEXT1632(auVar145),auVar116);
      auVar96 = vmaxps_avx(auVar7,auVar96);
      auVar156 = vcmpps_avx(auVar96,auVar133,1);
      auVar96 = vblendvps_avx(ZEXT1632(auVar15),auVar105,auVar156);
      auVar7 = vblendvps_avx(ZEXT1632(auVar141),local_4e0,auVar156);
      auVar15 = vfmadd213ps_fma(auVar160,auVar210,ZEXT1632(auVar113));
      auVar113 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar119,auVar119);
      auVar160 = vrsqrtps_avx(ZEXT1632(auVar113));
      fVar124 = auVar160._0_4_;
      fVar106 = auVar160._4_4_;
      fVar107 = auVar160._8_4_;
      fVar108 = auVar160._12_4_;
      fVar109 = auVar160._16_4_;
      fVar110 = auVar160._20_4_;
      fVar111 = auVar160._24_4_;
      auVar105._4_4_ = fVar106 * fVar106 * fVar106 * auVar113._4_4_ * -0.5;
      auVar105._0_4_ = fVar124 * fVar124 * fVar124 * auVar113._0_4_ * -0.5;
      auVar105._8_4_ = fVar107 * fVar107 * fVar107 * auVar113._8_4_ * -0.5;
      auVar105._12_4_ = fVar108 * fVar108 * fVar108 * auVar113._12_4_ * -0.5;
      auVar105._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar105._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar105._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar105._28_4_ = auVar197._28_4_;
      auVar153._8_4_ = 0x3fc00000;
      auVar153._0_8_ = 0x3fc000003fc00000;
      auVar153._12_4_ = 0x3fc00000;
      auVar153._16_4_ = 0x3fc00000;
      auVar153._20_4_ = 0x3fc00000;
      auVar153._24_4_ = 0x3fc00000;
      auVar153._28_4_ = 0x3fc00000;
      auVar113 = vfmadd231ps_fma(auVar105,auVar153,auVar160);
      fVar124 = auVar113._0_4_;
      fVar106 = auVar113._4_4_;
      auVar20._4_4_ = fVar106 * auVar119._4_4_;
      auVar20._0_4_ = fVar124 * auVar119._0_4_;
      fVar107 = auVar113._8_4_;
      auVar20._8_4_ = fVar107 * auVar119._8_4_;
      fVar108 = auVar113._12_4_;
      auVar20._12_4_ = fVar108 * auVar119._12_4_;
      auVar20._16_4_ = auVar119._16_4_ * 0.0;
      auVar20._20_4_ = auVar119._20_4_ * 0.0;
      auVar20._24_4_ = auVar119._24_4_ * 0.0;
      auVar20._28_4_ = 0;
      auVar21._4_4_ = fVar106 * -auVar103._4_4_;
      auVar21._0_4_ = fVar124 * -auVar103._0_4_;
      auVar21._8_4_ = fVar107 * -auVar103._8_4_;
      auVar21._12_4_ = fVar108 * -auVar103._12_4_;
      auVar21._16_4_ = -auVar103._16_4_ * 0.0;
      auVar21._20_4_ = -auVar103._20_4_ * 0.0;
      auVar21._24_4_ = -auVar103._24_4_ * 0.0;
      auVar21._28_4_ = auVar160._28_4_;
      auVar113 = vfmadd213ps_fma(auVar96,auVar96,ZEXT832(0) << 0x20);
      auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar7,auVar7);
      auVar197 = vrsqrtps_avx(ZEXT1632(auVar113));
      auVar22._28_4_ = auVar156._28_4_;
      auVar22._0_28_ =
           ZEXT1628(CONCAT412(fVar108 * 0.0,
                              CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar124 * 0.0))));
      fVar124 = auVar197._0_4_;
      fVar106 = auVar197._4_4_;
      fVar107 = auVar197._8_4_;
      fVar108 = auVar197._12_4_;
      fVar109 = auVar197._16_4_;
      fVar110 = auVar197._20_4_;
      fVar111 = auVar197._24_4_;
      auVar23._4_4_ = fVar106 * fVar106 * fVar106 * auVar113._4_4_ * -0.5;
      auVar23._0_4_ = fVar124 * fVar124 * fVar124 * auVar113._0_4_ * -0.5;
      auVar23._8_4_ = fVar107 * fVar107 * fVar107 * auVar113._8_4_ * -0.5;
      auVar23._12_4_ = fVar108 * fVar108 * fVar108 * auVar113._12_4_ * -0.5;
      auVar23._16_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar23._20_4_ = fVar110 * fVar110 * fVar110 * -0.0;
      auVar23._24_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar23._28_4_ = 0;
      auVar113 = vfmadd231ps_fma(auVar23,auVar153,auVar197);
      fVar124 = auVar113._0_4_;
      auVar195._0_4_ = auVar7._0_4_ * fVar124;
      fVar106 = auVar113._4_4_;
      auVar195._4_4_ = auVar7._4_4_ * fVar106;
      fVar107 = auVar113._8_4_;
      auVar195._8_4_ = auVar7._8_4_ * fVar107;
      fVar108 = auVar113._12_4_;
      auVar195._12_4_ = auVar7._12_4_ * fVar108;
      auVar195._16_4_ = auVar7._16_4_ * 0.0;
      auVar195._20_4_ = auVar7._20_4_ * 0.0;
      auVar195._24_4_ = auVar7._24_4_ * 0.0;
      auVar195._28_4_ = 0;
      auVar24._4_4_ = -auVar96._4_4_ * fVar106;
      auVar24._0_4_ = -auVar96._0_4_ * fVar124;
      auVar24._8_4_ = -auVar96._8_4_ * fVar107;
      auVar24._12_4_ = -auVar96._12_4_ * fVar108;
      auVar24._16_4_ = -auVar96._16_4_ * 0.0;
      auVar24._20_4_ = -auVar96._20_4_ * 0.0;
      auVar24._24_4_ = -auVar96._24_4_ * 0.0;
      auVar24._28_4_ = auVar7._28_4_;
      auVar25._28_4_ = auVar197._28_4_;
      auVar25._0_28_ =
           ZEXT1628(CONCAT412(fVar108 * 0.0,
                              CONCAT48(fVar107 * 0.0,CONCAT44(fVar106 * 0.0,fVar124 * 0.0))));
      auVar113 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar92),local_460);
      auVar96 = ZEXT1632(auVar92);
      auVar126 = vfmadd213ps_fma(auVar21,auVar96,local_4c0);
      auVar90 = vfmadd213ps_fma(auVar22,auVar96,ZEXT1632(auVar15));
      auVar141 = vfnmadd213ps_fma(auVar20,auVar96,local_460);
      auVar114 = vfmadd213ps_fma(auVar195,ZEXT1632(auVar91),_local_480);
      auVar145 = vfnmadd213ps_fma(auVar21,auVar96,local_4c0);
      auVar172 = ZEXT1632(auVar91);
      auVar91 = vfmadd213ps_fma(auVar24,auVar172,local_4a0);
      auVar215 = ZEXT1632(auVar92);
      auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar15),auVar215,auVar22);
      auVar15 = vfmadd213ps_fma(auVar25,auVar172,ZEXT1632(auVar147));
      auVar89 = vfnmadd213ps_fma(auVar195,auVar172,_local_480);
      auVar112 = vfnmadd213ps_fma(auVar24,auVar172,local_4a0);
      auVar161 = vfnmadd231ps_fma(ZEXT1632(auVar147),auVar172,auVar25);
      auVar96 = vsubps_avx(ZEXT1632(auVar91),ZEXT1632(auVar145));
      auVar197 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar155));
      auVar26._4_4_ = auVar155._4_4_ * auVar96._4_4_;
      auVar26._0_4_ = auVar155._0_4_ * auVar96._0_4_;
      auVar26._8_4_ = auVar155._8_4_ * auVar96._8_4_;
      auVar26._12_4_ = auVar155._12_4_ * auVar96._12_4_;
      auVar26._16_4_ = auVar96._16_4_ * 0.0;
      auVar26._20_4_ = auVar96._20_4_ * 0.0;
      auVar26._24_4_ = auVar96._24_4_ * 0.0;
      auVar26._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar26,ZEXT1632(auVar145),auVar197);
      auVar27._4_4_ = auVar197._4_4_ * auVar141._4_4_;
      auVar27._0_4_ = auVar197._0_4_ * auVar141._0_4_;
      auVar27._8_4_ = auVar197._8_4_ * auVar141._8_4_;
      auVar27._12_4_ = auVar197._12_4_ * auVar141._12_4_;
      auVar27._16_4_ = auVar197._16_4_ * 0.0;
      auVar27._20_4_ = auVar197._20_4_ * 0.0;
      auVar27._24_4_ = auVar197._24_4_ * 0.0;
      auVar27._28_4_ = auVar197._28_4_;
      auVar197 = vsubps_avx(ZEXT1632(auVar114),ZEXT1632(auVar141));
      auVar147 = vfmsub231ps_fma(auVar27,ZEXT1632(auVar155),auVar197);
      auVar28._4_4_ = auVar145._4_4_ * auVar197._4_4_;
      auVar28._0_4_ = auVar145._0_4_ * auVar197._0_4_;
      auVar28._8_4_ = auVar145._8_4_ * auVar197._8_4_;
      auVar28._12_4_ = auVar145._12_4_ * auVar197._12_4_;
      auVar28._16_4_ = auVar197._16_4_ * 0.0;
      auVar28._20_4_ = auVar197._20_4_ * 0.0;
      auVar28._24_4_ = auVar197._24_4_ * 0.0;
      auVar28._28_4_ = auVar197._28_4_;
      auVar156 = ZEXT1632(auVar141);
      auVar141 = vfmsub231ps_fma(auVar28,auVar156,auVar96);
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT832(0) << 0x20,ZEXT1632(auVar147));
      auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar92));
      auVar136 = vcmpps_avx(ZEXT1632(auVar147),ZEXT832(0) << 0x20,2);
      auVar96 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar113),auVar136);
      auVar197 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar126),auVar136);
      auVar160 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar90),auVar136);
      auVar103 = vblendvps_avx(auVar156,ZEXT1632(auVar114),auVar136);
      auVar119 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar91),auVar136);
      auVar7 = vblendvps_avx(ZEXT1632(auVar155),ZEXT1632(auVar15),auVar136);
      auVar156 = vblendvps_avx(ZEXT1632(auVar114),auVar156,auVar136);
      auVar97 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar145),auVar136);
      auVar147 = vpackssdw_avx(local_500._0_16_,local_500._16_16_);
      auVar105 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar155),auVar136);
      auVar198 = vsubps_avx(auVar156,auVar96);
      auVar211 = vsubps_avx(auVar97,auVar197);
      auVar17 = vsubps_avx(auVar105,auVar160);
      auVar115 = vsubps_avx(auVar96,auVar103);
      auVar121 = vsubps_avx(auVar197,auVar119);
      auVar16 = vsubps_avx(auVar160,auVar7);
      auVar29._4_4_ = auVar17._4_4_ * auVar96._4_4_;
      auVar29._0_4_ = auVar17._0_4_ * auVar96._0_4_;
      auVar29._8_4_ = auVar17._8_4_ * auVar96._8_4_;
      auVar29._12_4_ = auVar17._12_4_ * auVar96._12_4_;
      auVar29._16_4_ = auVar17._16_4_ * auVar96._16_4_;
      auVar29._20_4_ = auVar17._20_4_ * auVar96._20_4_;
      auVar29._24_4_ = auVar17._24_4_ * auVar96._24_4_;
      auVar29._28_4_ = auVar105._28_4_;
      auVar15 = vfmsub231ps_fma(auVar29,auVar160,auVar198);
      auVar30._4_4_ = auVar198._4_4_ * auVar197._4_4_;
      auVar30._0_4_ = auVar198._0_4_ * auVar197._0_4_;
      auVar30._8_4_ = auVar198._8_4_ * auVar197._8_4_;
      auVar30._12_4_ = auVar198._12_4_ * auVar197._12_4_;
      auVar30._16_4_ = auVar198._16_4_ * auVar197._16_4_;
      auVar30._20_4_ = auVar198._20_4_ * auVar197._20_4_;
      auVar30._24_4_ = auVar198._24_4_ * auVar197._24_4_;
      auVar30._28_4_ = auVar156._28_4_;
      auVar92 = vfmsub231ps_fma(auVar30,auVar96,auVar211);
      auVar64 = ZEXT812(0);
      auVar196 = ZEXT1232(auVar64) << 0x20;
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1232(auVar64) << 0x20,ZEXT1632(auVar15));
      auVar100._0_4_ = auVar211._0_4_ * auVar160._0_4_;
      auVar100._4_4_ = auVar211._4_4_ * auVar160._4_4_;
      auVar100._8_4_ = auVar211._8_4_ * auVar160._8_4_;
      auVar100._12_4_ = auVar211._12_4_ * auVar160._12_4_;
      auVar100._16_4_ = auVar211._16_4_ * auVar160._16_4_;
      auVar100._20_4_ = auVar211._20_4_ * auVar160._20_4_;
      auVar100._24_4_ = auVar211._24_4_ * auVar160._24_4_;
      auVar100._28_4_ = 0;
      auVar92 = vfmsub231ps_fma(auVar100,auVar197,auVar17);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1232(auVar64) << 0x20,ZEXT1632(auVar92));
      auVar101._0_4_ = auVar16._0_4_ * auVar103._0_4_;
      auVar101._4_4_ = auVar16._4_4_ * auVar103._4_4_;
      auVar101._8_4_ = auVar16._8_4_ * auVar103._8_4_;
      auVar101._12_4_ = auVar16._12_4_ * auVar103._12_4_;
      auVar101._16_4_ = auVar16._16_4_ * auVar103._16_4_;
      auVar101._20_4_ = auVar16._20_4_ * auVar103._20_4_;
      auVar101._24_4_ = auVar16._24_4_ * auVar103._24_4_;
      auVar101._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar101,auVar115,auVar7);
      auVar31._4_4_ = auVar121._4_4_ * auVar7._4_4_;
      auVar31._0_4_ = auVar121._0_4_ * auVar7._0_4_;
      auVar31._8_4_ = auVar121._8_4_ * auVar7._8_4_;
      auVar31._12_4_ = auVar121._12_4_ * auVar7._12_4_;
      auVar31._16_4_ = auVar121._16_4_ * auVar7._16_4_;
      auVar31._20_4_ = auVar121._20_4_ * auVar7._20_4_;
      auVar31._24_4_ = auVar121._24_4_ * auVar7._24_4_;
      auVar31._28_4_ = auVar7._28_4_;
      auVar91 = vfmsub231ps_fma(auVar31,auVar119,auVar16);
      auVar32._4_4_ = auVar115._4_4_ * auVar119._4_4_;
      auVar32._0_4_ = auVar115._0_4_ * auVar119._0_4_;
      auVar32._8_4_ = auVar115._8_4_ * auVar119._8_4_;
      auVar32._12_4_ = auVar115._12_4_ * auVar119._12_4_;
      auVar32._16_4_ = auVar115._16_4_ * auVar119._16_4_;
      auVar32._20_4_ = auVar115._20_4_ * auVar119._20_4_;
      auVar32._24_4_ = auVar115._24_4_ * auVar119._24_4_;
      auVar32._28_4_ = auVar97._28_4_;
      auVar113 = vfmsub231ps_fma(auVar32,auVar121,auVar103);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT1232(auVar64) << 0x20,ZEXT1632(auVar15));
      auVar91 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1232(auVar64) << 0x20,ZEXT1632(auVar91));
      auVar103 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar91));
      auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
      auVar15 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
      auVar147 = vpand_avx(auVar15,auVar147);
      auVar103 = vpmovsxwd_avx2(auVar147);
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
        auVar199 = ZEXT864(0) << 0x20;
LAB_0112d6bb:
        auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar96 = vpcmpeqd_avx2(auVar196,auVar196);
        auVar139 = ZEXT3264(auVar96);
      }
      else {
        auVar33._4_4_ = auVar211._4_4_ * auVar16._4_4_;
        auVar33._0_4_ = auVar211._0_4_ * auVar16._0_4_;
        auVar33._8_4_ = auVar211._8_4_ * auVar16._8_4_;
        auVar33._12_4_ = auVar211._12_4_ * auVar16._12_4_;
        auVar33._16_4_ = auVar211._16_4_ * auVar16._16_4_;
        auVar33._20_4_ = auVar211._20_4_ * auVar16._20_4_;
        auVar33._24_4_ = auVar211._24_4_ * auVar16._24_4_;
        auVar33._28_4_ = auVar103._28_4_;
        auVar90 = vfmsub231ps_fma(auVar33,auVar121,auVar17);
        auVar117._0_4_ = auVar17._0_4_ * auVar115._0_4_;
        auVar117._4_4_ = auVar17._4_4_ * auVar115._4_4_;
        auVar117._8_4_ = auVar17._8_4_ * auVar115._8_4_;
        auVar117._12_4_ = auVar17._12_4_ * auVar115._12_4_;
        auVar117._16_4_ = auVar17._16_4_ * auVar115._16_4_;
        auVar117._20_4_ = auVar17._20_4_ * auVar115._20_4_;
        auVar117._24_4_ = auVar17._24_4_ * auVar115._24_4_;
        auVar117._28_4_ = 0;
        auVar126 = vfmsub231ps_fma(auVar117,auVar198,auVar16);
        auVar34._4_4_ = auVar198._4_4_ * auVar121._4_4_;
        auVar34._0_4_ = auVar198._0_4_ * auVar121._0_4_;
        auVar34._8_4_ = auVar198._8_4_ * auVar121._8_4_;
        auVar34._12_4_ = auVar198._12_4_ * auVar121._12_4_;
        auVar34._16_4_ = auVar198._16_4_ * auVar121._16_4_;
        auVar34._20_4_ = auVar198._20_4_ * auVar121._20_4_;
        auVar34._24_4_ = auVar198._24_4_ * auVar121._24_4_;
        auVar34._28_4_ = auVar119._28_4_;
        auVar114 = vfmsub231ps_fma(auVar34,auVar115,auVar211);
        auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar114));
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar90),_DAT_01f7b000);
        auVar103 = vrcpps_avx(ZEXT1632(auVar113));
        auVar196._8_4_ = 0x3f800000;
        auVar196._0_8_ = 0x3f8000003f800000;
        auVar196._12_4_ = 0x3f800000;
        auVar196._16_4_ = 0x3f800000;
        auVar196._20_4_ = 0x3f800000;
        auVar196._24_4_ = 0x3f800000;
        auVar196._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar113),auVar196);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar103,auVar103);
        auVar166._0_4_ = auVar114._0_4_ * auVar160._0_4_;
        auVar166._4_4_ = auVar114._4_4_ * auVar160._4_4_;
        auVar166._8_4_ = auVar114._8_4_ * auVar160._8_4_;
        auVar166._12_4_ = auVar114._12_4_ * auVar160._12_4_;
        auVar166._16_4_ = auVar160._16_4_ * 0.0;
        auVar166._20_4_ = auVar160._20_4_ * 0.0;
        auVar166._24_4_ = auVar160._24_4_ * 0.0;
        auVar166._28_4_ = 0;
        auVar126 = vfmadd231ps_fma(auVar166,auVar197,ZEXT1632(auVar126));
        auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),ZEXT1632(auVar90),auVar96);
        fVar124 = auVar15._0_4_;
        fVar106 = auVar15._4_4_;
        fVar107 = auVar15._8_4_;
        fVar108 = auVar15._12_4_;
        auVar160 = ZEXT1632(CONCAT412(fVar108 * auVar126._12_4_,
                                      CONCAT48(fVar107 * auVar126._8_4_,
                                               CONCAT44(fVar106 * auVar126._4_4_,
                                                        fVar124 * auVar126._0_4_))));
        auVar102._4_4_ = uVar4;
        auVar102._0_4_ = uVar4;
        auVar102._8_4_ = uVar4;
        auVar102._12_4_ = uVar4;
        auVar102._16_4_ = uVar4;
        auVar102._20_4_ = uVar4;
        auVar102._24_4_ = uVar4;
        auVar102._28_4_ = uVar4;
        uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar118._4_4_ = uVar78;
        auVar118._0_4_ = uVar78;
        auVar118._8_4_ = uVar78;
        auVar118._12_4_ = uVar78;
        auVar118._16_4_ = uVar78;
        auVar118._20_4_ = uVar78;
        auVar118._24_4_ = uVar78;
        auVar118._28_4_ = uVar78;
        auVar96 = vcmpps_avx(auVar102,auVar160,2);
        auVar197 = vcmpps_avx(auVar160,auVar118,2);
        auVar96 = vandps_avx(auVar197,auVar96);
        auVar15 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar147 = vpand_avx(auVar147,auVar15);
        auVar96 = vpmovsxwd_avx2(auVar147);
        auVar199 = ZEXT864(0) << 0x20;
        if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar96 >> 0x7f,0) == '\0') &&
              (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0xbf,0) == '\0') &&
            (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar96[0x1f]) goto LAB_0112d6bb;
        auVar96 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar113),4);
        auVar15 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
        auVar147 = vpand_avx(auVar147,auVar15);
        auVar197 = vpmovsxwd_avx2(auVar147);
        auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                      CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
        auVar96 = vpcmpeqd_avx2(auVar196,auVar196);
        auVar139 = ZEXT3264(auVar96);
        if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar197 >> 0x7f,0) != '\0') ||
              (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar197 >> 0xbf,0) != '\0') ||
            (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar197[0x1f] < '\0') {
          auVar103 = ZEXT1632(CONCAT412(fVar108 * auVar92._12_4_,
                                        CONCAT48(fVar107 * auVar92._8_4_,
                                                 CONCAT44(fVar106 * auVar92._4_4_,
                                                          fVar124 * auVar92._0_4_))));
          auVar119 = ZEXT1632(CONCAT412(fVar108 * auVar91._12_4_,
                                        CONCAT48(fVar107 * auVar91._8_4_,
                                                 CONCAT44(fVar106 * auVar91._4_4_,
                                                          fVar124 * auVar91._0_4_))));
          auVar154._8_4_ = 0x3f800000;
          auVar154._0_8_ = 0x3f8000003f800000;
          auVar154._12_4_ = 0x3f800000;
          auVar154._16_4_ = 0x3f800000;
          auVar154._20_4_ = 0x3f800000;
          auVar154._24_4_ = 0x3f800000;
          auVar154._28_4_ = 0x3f800000;
          auVar96 = vsubps_avx(auVar154,auVar103);
          _local_3c0 = vblendvps_avx(auVar96,auVar103,auVar136);
          auVar96 = vsubps_avx(auVar154,auVar119);
          local_520 = vblendvps_avx(auVar96,auVar119,auVar136);
          auVar173 = ZEXT3264(auVar197);
          local_3e0 = auVar160;
        }
      }
      auVar186 = ZEXT3264(auVar210);
      auVar96 = auVar173._0_32_;
      if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar96 >> 0x7f,0) == '\0') &&
            (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar96 >> 0xbf,0) == '\0') &&
          (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar173[0x1f]) {
        auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
      }
      else {
        auVar197 = vsubps_avx(auVar172,auVar215);
        auVar147 = vfmadd213ps_fma(auVar197,_local_3c0,auVar215);
        fVar124 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
        auVar35._4_4_ = (auVar147._4_4_ + auVar147._4_4_) * fVar124;
        auVar35._0_4_ = (auVar147._0_4_ + auVar147._0_4_) * fVar124;
        auVar35._8_4_ = (auVar147._8_4_ + auVar147._8_4_) * fVar124;
        auVar35._12_4_ = (auVar147._12_4_ + auVar147._12_4_) * fVar124;
        auVar35._16_4_ = fVar124 * 0.0;
        auVar35._20_4_ = fVar124 * 0.0;
        auVar35._24_4_ = fVar124 * 0.0;
        auVar35._28_4_ = 0;
        auVar197 = vcmpps_avx(local_3e0,auVar35,6);
        auVar160 = auVar96 & auVar197;
        auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(fVar203,
                                                  CONCAT412(fVar203,CONCAT48(fVar203,CONCAT44(
                                                  fVar203,fVar203))))))));
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar160[0x1f] < '\0') {
          auVar120._8_4_ = 0xbf800000;
          auVar120._0_8_ = 0xbf800000bf800000;
          auVar120._12_4_ = 0xbf800000;
          auVar120._16_4_ = 0xbf800000;
          auVar120._20_4_ = 0xbf800000;
          auVar120._24_4_ = 0xbf800000;
          auVar120._28_4_ = 0xbf800000;
          auVar134._8_4_ = 0x40000000;
          auVar134._0_8_ = 0x4000000040000000;
          auVar134._12_4_ = 0x40000000;
          auVar134._16_4_ = 0x40000000;
          auVar134._20_4_ = 0x40000000;
          auVar134._24_4_ = 0x40000000;
          auVar134._28_4_ = 0x40000000;
          auVar147 = vfmadd213ps_fma(local_520,auVar134,auVar120);
          local_380 = _local_3c0;
          local_360 = ZEXT1632(auVar147);
          local_340 = local_3e0;
          local_320 = 0;
          local_300 = local_730;
          uStack_2f8 = uStack_728;
          local_2f0 = local_740;
          uStack_2e8 = uStack_738;
          local_520 = local_360;
          if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
            uVar82 = 0;
          }
          else {
            pGVar80 = (Geometry *)context->args;
            if ((((Geometry *)context->args)->device != (Device *)0x0) ||
               (uVar82 = CONCAT71((int7)((ulong)pGVar9 >> 8),1), pGVar80 = pGVar9,
               pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar96 = vandps_avx(auVar197,auVar96);
              fVar124 = 1.0 / auVar98._0_4_;
              local_2a0[0] = fVar124 * ((float)local_3c0._0_4_ + 0.0);
              local_2a0[1] = fVar124 * ((float)local_3c0._4_4_ + 1.0);
              local_2a0[2] = fVar124 * (fStack_3b8 + 2.0);
              local_2a0[3] = fVar124 * (fStack_3b4 + 3.0);
              fStack_290 = fVar124 * (fStack_3b0 + 4.0);
              fStack_28c = fVar124 * (fStack_3ac + 5.0);
              fStack_288 = fVar124 * (fStack_3a8 + 6.0);
              fStack_284 = fStack_3a4 + 7.0;
              local_520._0_8_ = auVar147._0_8_;
              local_520._8_8_ = auVar147._8_8_;
              local_280 = local_520._0_8_;
              uStack_278 = local_520._8_8_;
              uStack_270 = 0;
              uStack_268 = 0;
              local_260 = local_3e0;
              uVar78 = vmovmskps_avx(auVar96);
              uVar82 = 0;
              uVar84 = CONCAT44((int)((ulong)pGVar80 >> 0x20),uVar78);
              for (uVar18 = uVar84; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                uVar82 = uVar82 + 1;
              }
              local_7e0 = CONCAT44(uVar83,uVar83);
              uStack_7d8._0_4_ = uVar83;
              uStack_7d8._4_4_ = uVar83;
              uStack_7d0._0_4_ = uVar83;
              uStack_7d0._4_4_ = uVar83;
              auVar76 = _local_7e0;
              uStack_7c8._0_4_ = uVar83;
              uStack_7c8._4_4_ = uVar83;
              auVar96 = _local_7e0;
              local_660._0_4_ = local_660._4_4_;
              local_660._8_4_ = local_660._4_4_;
              local_660._12_4_ = local_660._4_4_;
              local_660._16_4_ = local_660._4_4_;
              local_660._20_4_ = local_660._4_4_;
              local_660._24_4_ = local_660._4_4_;
              local_660._28_4_ = local_660._4_4_;
              uVar207 = uVar88;
              uVar208 = uVar88;
              uVar209 = uVar88;
              local_6e0 = auVar210;
              local_680 = uVar88;
              local_31c = iVar77;
              local_310 = uVar71;
              uStack_308 = uVar72;
              while (auVar210 = auVar186._0_32_, uVar84 != 0) {
                uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
                fVar124 = local_2a0[uVar82];
                auVar94._4_4_ = fVar124;
                auVar94._0_4_ = fVar124;
                auVar94._8_4_ = fVar124;
                auVar94._12_4_ = fVar124;
                local_1e0._16_4_ = fVar124;
                local_1e0._0_16_ = auVar94;
                local_1e0._20_4_ = fVar124;
                local_1e0._24_4_ = fVar124;
                local_1e0._28_4_ = fVar124;
                local_1c0 = *(undefined4 *)((long)&local_280 + uVar82 * 4);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar82 * 4);
                fVar107 = 1.0 - fVar124;
                auVar147 = ZEXT416((uint)(fVar124 * fVar107 * 4.0));
                auVar15 = vfnmsub213ss_fma(auVar94,auVar94,auVar147);
                auVar147 = vfmadd213ss_fma(ZEXT416((uint)fVar107),ZEXT416((uint)fVar107),auVar147);
                fVar106 = auVar147._0_4_ * 0.5;
                fVar124 = fVar124 * fVar124 * 0.5;
                auVar148._0_4_ = fVar124 * (float)local_620._0_4_;
                auVar148._4_4_ = fVar124 * (float)local_620._4_4_;
                auVar148._8_4_ = fVar124 * fStack_618;
                auVar148._12_4_ = fVar124 * fStack_614;
                auVar127._4_4_ = fVar106;
                auVar127._0_4_ = fVar106;
                auVar127._8_4_ = fVar106;
                auVar127._12_4_ = fVar106;
                auVar147 = vfmadd132ps_fma(auVar127,auVar148,auVar14);
                fVar124 = auVar15._0_4_ * 0.5;
                auVar149._4_4_ = fVar124;
                auVar149._0_4_ = fVar124;
                auVar149._8_4_ = fVar124;
                auVar149._12_4_ = fVar124;
                auVar147 = vfmadd132ps_fma(auVar149,auVar147,auVar13);
                local_710.context = context->user;
                fVar124 = fVar107 * -fVar107 * 0.5;
                auVar128._4_4_ = fVar124;
                auVar128._0_4_ = fVar124;
                auVar128._8_4_ = fVar124;
                auVar128._12_4_ = fVar124;
                auVar15 = vfmadd132ps_fma(auVar128,auVar147,auVar150);
                local_240 = auVar15._0_4_;
                uStack_23c = local_240;
                uStack_238 = local_240;
                uStack_234 = local_240;
                uStack_230 = local_240;
                uStack_22c = local_240;
                uStack_228 = local_240;
                uStack_224 = local_240;
                auVar147 = vmovshdup_avx(auVar15);
                local_220 = auVar147._0_8_;
                uStack_218 = local_220;
                uStack_210 = local_220;
                uStack_208 = local_220;
                auVar147 = vshufps_avx(auVar15,auVar15,0xaa);
                local_200._8_8_ = auVar147._0_8_;
                local_200._0_8_ = local_200._8_8_;
                local_200._16_8_ = local_200._8_8_;
                local_200._24_8_ = local_200._8_8_;
                uStack_1bc = local_1c0;
                uStack_1b8 = local_1c0;
                uStack_1b4 = local_1c0;
                uStack_1b0 = local_1c0;
                uStack_1ac = local_1c0;
                uStack_1a8 = local_1c0;
                uStack_1a4 = local_1c0;
                local_1a0 = local_660._0_8_;
                uStack_198 = local_660._8_8_;
                uStack_190 = local_660._16_8_;
                uStack_188 = local_660._24_8_;
                uStack_7d0 = auVar76._16_8_;
                uStack_7c8 = auVar96._24_8_;
                local_180 = local_7e0;
                uStack_178 = uStack_7d8;
                uStack_170 = uStack_7d0;
                uStack_168 = uStack_7c8;
                local_160 = (local_710.context)->instID[0];
                uStack_15c = local_160;
                uStack_158 = local_160;
                uStack_154 = local_160;
                uStack_150 = local_160;
                uStack_14c = local_160;
                uStack_148 = local_160;
                uStack_144 = local_160;
                local_140 = (local_710.context)->instPrimID[0];
                uStack_13c = local_140;
                uStack_138 = local_140;
                uStack_134 = local_140;
                uStack_130 = local_140;
                uStack_12c = local_140;
                uStack_128 = local_140;
                uStack_124 = local_140;
                local_640 = local_400;
                local_710.valid = (int *)local_640;
                local_710.geometryUserPtr = *(void **)(CONCAT44(uStack_5dc,local_5e0) + 0x18);
                local_710.hit = (RTCHitN *)&local_240;
                local_710.N = 8;
                pcVar10 = *(code **)(CONCAT44(uStack_5dc,local_5e0) + 0x48);
                local_710.ray = (RTCRayN *)ray;
                if (pcVar10 != (code *)0x0) {
                  auVar197 = ZEXT1632(auVar139._0_16_);
                  (*pcVar10)(&local_710);
                  auVar186 = ZEXT3264(local_6e0);
                  auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,
                                                  CONCAT416(fVar203,CONCAT412(fVar203,CONCAT48(
                                                  fVar203,CONCAT44(fVar203,fVar203))))))));
                  auVar197 = vpcmpeqd_avx2(auVar197,auVar197);
                  auVar139 = ZEXT3264(auVar197);
                  auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                  uVar88 = local_680;
                  uVar207 = uStack_678;
                  uVar208 = uStack_670;
                  uVar209 = uStack_668;
                }
                auVar160 = vpcmpeqd_avx2(auVar199._0_32_,local_640);
                auVar197 = auVar139._0_32_ & ~auVar160;
                if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar197 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar197 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar197 >> 0x7f,0) == '\0') &&
                      (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar197 >> 0xbf,0) == '\0') &&
                    (auVar197 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar197[0x1f]) {
                  auVar160 = auVar139._0_32_ ^ auVar160;
                }
                else {
                  p_Var11 = context->args->filter;
                  if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      ((*(byte *)(CONCAT44(uStack_5dc,local_5e0) + 0x3e) & 0x40) != 0)))) {
                    auVar197 = ZEXT1632(auVar139._0_16_);
                    (*p_Var11)(&local_710);
                    auVar186 = ZEXT3264(local_6e0);
                    auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,
                                                  CONCAT416(fVar203,CONCAT412(fVar203,CONCAT48(
                                                  fVar203,CONCAT44(fVar203,fVar203))))))));
                    auVar197 = vpcmpeqd_avx2(auVar197,auVar197);
                    auVar139 = ZEXT3264(auVar197);
                    auVar199 = ZEXT1664(ZEXT816(0) << 0x40);
                    uVar88 = local_680;
                    uVar207 = uStack_678;
                    uVar208 = uStack_670;
                    uVar209 = uStack_668;
                  }
                  auVar197 = vpcmpeqd_avx2(auVar199._0_32_,local_640);
                  auVar160 = auVar139._0_32_ ^ auVar197;
                  auVar135._8_4_ = 0xff800000;
                  auVar135._0_8_ = 0xff800000ff800000;
                  auVar135._12_4_ = 0xff800000;
                  auVar135._16_4_ = 0xff800000;
                  auVar135._20_4_ = 0xff800000;
                  auVar135._24_4_ = 0xff800000;
                  auVar135._28_4_ = 0xff800000;
                  auVar197 = vblendvps_avx(auVar135,*(undefined1 (*) [32])(local_710.ray + 0x100),
                                           auVar197);
                  *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar197;
                }
                auVar210 = auVar186._0_32_;
                if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar160 >> 0x7f,0) != '\0') ||
                      (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar160 >> 0xbf,0) != '\0') ||
                    (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar160[0x1f] < '\0') {
                  uVar82 = CONCAT71((int7)(uVar82 >> 8),1);
                  uStack_678 = uVar207;
                  uStack_670 = uVar208;
                  uStack_668 = uVar209;
                  goto LAB_0112c2b4;
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar78;
                uVar18 = uVar82 & 0x3f;
                uVar82 = 0;
                uVar84 = uVar84 ^ 1L << uVar18;
                for (uVar18 = uVar84; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
                {
                  uVar82 = uVar82 + 1;
                }
              }
              uVar82 = 0;
              uStack_678 = uVar207;
              uStack_670 = uVar208;
              uStack_668 = uVar209;
            }
          }
          goto LAB_0112c2b4;
        }
      }
      uVar82 = 0;
    }
LAB_0112c2b4:
    auVar202 = ZEXT3264(auVar202._0_32_);
    auVar199 = ZEXT3264(local_6a0);
    auVar139 = ZEXT464((uint)fVar125);
    if (8 < iVar77) {
      local_4c0._4_4_ = iVar77;
      local_4c0._0_4_ = iVar77;
      local_4c0._8_4_ = iVar77;
      local_4c0._12_4_ = iVar77;
      local_4c0._16_4_ = iVar77;
      local_4c0._20_4_ = iVar77;
      local_4c0._24_4_ = iVar77;
      local_4c0._28_4_ = iVar77;
      local_500._4_4_ = fVar125;
      local_500._0_4_ = fVar125;
      fStack_4f8 = fVar125;
      fStack_4f4 = fVar125;
      fStack_4f0 = fVar125;
      fStack_4ec = fVar125;
      fStack_4e8 = fVar125;
      fStack_4e4 = fVar125;
      local_5e0 = local_6c0._0_4_;
      uStack_5dc = local_6c0._0_4_;
      uStack_5d8 = local_6c0._0_4_;
      uStack_5d4 = local_6c0._0_4_;
      uStack_5d0 = local_6c0._0_4_;
      uStack_5cc = local_6c0._0_4_;
      uStack_5c8 = local_6c0._0_4_;
      uStack_5c4 = local_6c0._0_4_;
      local_120 = 1.0 / (float)local_560._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      local_560._4_4_ = uVar83;
      local_560._0_4_ = uVar83;
      uStack_558._0_4_ = uVar83;
      uStack_558._4_4_ = uVar83;
      local_100 = local_5a0._0_4_;
      uStack_fc = local_5a0._0_4_;
      uStack_f8 = local_5a0._0_4_;
      uStack_f4 = local_5a0._0_4_;
      uStack_f0 = local_5a0._0_4_;
      uStack_ec = local_5a0._0_4_;
      uStack_e8 = local_5a0._0_4_;
      uStack_e4 = local_5a0._0_4_;
      local_6e0 = auVar210;
      local_680 = uVar88;
      uStack_550 = uVar83;
      uStack_54c = uVar83;
      uStack_548 = uVar83;
      uStack_544 = uVar83;
      for (lVar86 = 8; lVar86 < local_610; lVar86 = lVar86 + 8) {
        auVar198 = auVar199._0_32_;
        auVar96 = *(undefined1 (*) [32])(bspline_basis0 + lVar86 * 4 + lVar87);
        auVar197 = *(undefined1 (*) [32])(lVar87 + 0x21fffac + lVar86 * 4);
        auVar160 = *(undefined1 (*) [32])(lVar87 + 0x2200430 + lVar86 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar87 + 0x22008b4 + lVar86 * 4);
        fVar111 = *(float *)*pauVar2;
        fVar123 = *(float *)(*pauVar2 + 4);
        fVar178 = *(float *)(*pauVar2 + 8);
        fVar187 = *(float *)(*pauVar2 + 0xc);
        fVar188 = *(float *)(*pauVar2 + 0x10);
        fVar189 = *(float *)(*pauVar2 + 0x14);
        fVar190 = *(float *)(*pauVar2 + 0x18);
        auVar74 = *(undefined1 (*) [28])*pauVar2;
        auVar186._0_4_ = fVar111 * auVar173._0_4_;
        auVar186._4_4_ = fVar123 * auVar173._4_4_;
        auVar186._8_4_ = fVar178 * auVar173._8_4_;
        auVar186._12_4_ = fVar187 * auVar173._12_4_;
        auVar186._16_4_ = fVar188 * auVar173._16_4_;
        auVar186._20_4_ = fVar189 * auVar173._20_4_;
        auVar186._28_36_ = auVar199._28_36_;
        auVar186._24_4_ = fVar190 * auVar173._24_4_;
        auVar199._0_4_ = fVar111 * fVar140;
        auVar199._4_4_ = fVar123 * fVar144;
        auVar199._8_4_ = fVar178 * fVar140;
        auVar199._12_4_ = fVar187 * fVar144;
        auVar199._16_4_ = fVar188 * fVar140;
        auVar199._20_4_ = fVar189 * fVar144;
        auVar199._28_36_ = auVar139._28_36_;
        auVar199._24_4_ = fVar190 * fVar140;
        auVar150 = vfmadd231ps_fma(auVar186._0_32_,auVar160,auVar132);
        auVar147 = vfmadd231ps_fma(auVar199._0_32_,auVar160,auVar182);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar197,auVar194);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar197,local_440);
        auVar150 = vfmadd231ps_fma(ZEXT1632(auVar150),auVar96,auVar214);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),auVar96,local_5c0);
        auVar103 = *(undefined1 (*) [32])(bspline_basis1 + lVar86 * 4 + lVar87);
        auVar119 = *(undefined1 (*) [32])(lVar87 + 0x22023cc + lVar86 * 4);
        auVar7 = *(undefined1 (*) [32])(lVar87 + 0x2202850 + lVar86 * 4);
        pfVar3 = (float *)(lVar87 + 0x2202cd4 + lVar86 * 4);
        fVar191 = *pfVar3;
        fVar192 = pfVar3[1];
        fVar66 = pfVar3[2];
        fVar67 = pfVar3[3];
        fVar68 = pfVar3[4];
        fVar69 = pfVar3[5];
        fVar70 = pfVar3[6];
        auVar36._4_4_ = fVar192 * auVar173._4_4_;
        auVar36._0_4_ = fVar191 * auVar173._0_4_;
        auVar36._8_4_ = fVar66 * auVar173._8_4_;
        auVar36._12_4_ = fVar67 * auVar173._12_4_;
        auVar36._16_4_ = fVar68 * auVar173._16_4_;
        auVar36._20_4_ = fVar69 * auVar173._20_4_;
        uVar78 = local_5c0._28_4_;
        auVar36._24_4_ = fVar70 * auVar173._24_4_;
        auVar36._28_4_ = uVar78;
        auVar139._0_4_ = fVar191 * fVar140;
        auVar139._4_4_ = fVar192 * fVar144;
        auVar139._8_4_ = fVar66 * fVar140;
        auVar139._12_4_ = fVar67 * fVar144;
        auVar139._16_4_ = fVar68 * fVar140;
        auVar139._20_4_ = fVar69 * fVar144;
        auVar139._28_36_ = auVar173._28_36_;
        auVar139._24_4_ = fVar70 * fVar140;
        auVar15 = vfmadd231ps_fma(auVar36,auVar7,auVar132);
        auVar92 = vfmadd231ps_fma(auVar139._0_32_,auVar7,auVar182);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,auVar194);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar119,local_440);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar103,auVar214);
        auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar103,local_5c0);
        local_460 = ZEXT1632(auVar15);
        local_6c0 = ZEXT1632(auVar150);
        local_4a0 = vsubps_avx(local_460,local_6c0);
        local_660 = ZEXT1632(auVar92);
        auVar136 = ZEXT1632(auVar147);
        local_5a0 = vsubps_avx(local_660,auVar136);
        auVar104._0_4_ = auVar147._0_4_ * local_4a0._0_4_;
        auVar104._4_4_ = auVar147._4_4_ * local_4a0._4_4_;
        auVar104._8_4_ = auVar147._8_4_ * local_4a0._8_4_;
        auVar104._12_4_ = auVar147._12_4_ * local_4a0._12_4_;
        auVar104._16_4_ = local_4a0._16_4_ * 0.0;
        auVar104._20_4_ = local_4a0._20_4_ * 0.0;
        auVar104._24_4_ = local_4a0._24_4_ * 0.0;
        auVar104._28_4_ = 0;
        fVar125 = local_5a0._0_4_;
        fVar124 = local_5a0._4_4_;
        auVar75._4_4_ = auVar150._4_4_ * fVar124;
        auVar75._0_4_ = auVar150._0_4_ * fVar125;
        fVar106 = local_5a0._8_4_;
        auVar75._8_4_ = auVar150._8_4_ * fVar106;
        fVar107 = local_5a0._12_4_;
        auVar75._12_4_ = auVar150._12_4_ * fVar107;
        fVar108 = local_5a0._16_4_;
        auVar75._16_4_ = fVar108 * 0.0;
        fVar109 = local_5a0._20_4_;
        auVar75._20_4_ = fVar109 * 0.0;
        fVar110 = local_5a0._24_4_;
        auVar75._24_4_ = fVar110 * 0.0;
        auVar75._28_4_ = uVar200;
        auVar97 = vsubps_avx(auVar104,auVar75);
        auVar37._4_4_ = fVar123 * local_e0._4_4_;
        auVar37._0_4_ = fVar111 * (float)local_e0;
        auVar37._8_4_ = fVar178 * (float)uStack_d8;
        auVar37._12_4_ = fVar187 * uStack_d8._4_4_;
        auVar37._16_4_ = fVar188 * (float)uStack_d0;
        auVar37._20_4_ = fVar189 * uStack_d0._4_4_;
        auVar37._24_4_ = fVar190 * (float)uStack_c8;
        auVar37._28_4_ = uVar78;
        auVar139 = ZEXT3264(local_c0);
        auVar147 = vfmadd231ps_fma(auVar37,local_c0,auVar160);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_a0,auVar197);
        auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),local_80,auVar96);
        auVar38._4_4_ = fVar192 * local_e0._4_4_;
        auVar38._0_4_ = fVar191 * (float)local_e0;
        auVar38._8_4_ = fVar66 * (float)uStack_d8;
        auVar38._12_4_ = fVar67 * uStack_d8._4_4_;
        auVar38._16_4_ = fVar68 * (float)uStack_d0;
        auVar38._20_4_ = fVar69 * uStack_d0._4_4_;
        auVar38._24_4_ = fVar70 * (float)uStack_c8;
        auVar38._28_4_ = uStack_c8._4_4_;
        auVar15 = vfmadd231ps_fma(auVar38,auVar7,local_c0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar119,local_a0);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar103,local_80);
        auVar65._4_4_ = fVar124 * fVar124;
        auVar65._0_4_ = fVar125 * fVar125;
        auVar65._8_4_ = fVar106 * fVar106;
        auVar65._12_4_ = fVar107 * fVar107;
        auVar65._16_4_ = fVar108 * fVar108;
        auVar65._20_4_ = fVar109 * fVar109;
        auVar65._24_4_ = fVar110 * fVar110;
        auVar65._28_4_ = local_440._28_4_;
        auVar92 = vfmadd231ps_fma(auVar65,local_4a0,local_4a0);
        auVar211 = ZEXT1632(auVar147);
        auVar156 = vmaxps_avx(auVar211,ZEXT1632(auVar15));
        auVar183._0_4_ = auVar156._0_4_ * auVar156._0_4_ * auVar92._0_4_;
        auVar183._4_4_ = auVar156._4_4_ * auVar156._4_4_ * auVar92._4_4_;
        auVar183._8_4_ = auVar156._8_4_ * auVar156._8_4_ * auVar92._8_4_;
        auVar183._12_4_ = auVar156._12_4_ * auVar156._12_4_ * auVar92._12_4_;
        auVar183._16_4_ = auVar156._16_4_ * auVar156._16_4_ * 0.0;
        auVar183._20_4_ = auVar156._20_4_ * auVar156._20_4_ * 0.0;
        auVar183._24_4_ = auVar156._24_4_ * auVar156._24_4_ * 0.0;
        auVar183._28_4_ = 0;
        auVar39._4_4_ = auVar97._4_4_ * auVar97._4_4_;
        auVar39._0_4_ = auVar97._0_4_ * auVar97._0_4_;
        auVar39._8_4_ = auVar97._8_4_ * auVar97._8_4_;
        auVar39._12_4_ = auVar97._12_4_ * auVar97._12_4_;
        auVar39._16_4_ = auVar97._16_4_ * auVar97._16_4_;
        auVar39._20_4_ = auVar97._20_4_ * auVar97._20_4_;
        auVar39._24_4_ = auVar97._24_4_ * auVar97._24_4_;
        auVar39._28_4_ = auVar97._28_4_;
        auVar156 = vcmpps_avx(auVar39,auVar183,2);
        local_320 = (int)lVar86;
        auVar184._4_4_ = local_320;
        auVar184._0_4_ = local_320;
        auVar184._8_4_ = local_320;
        auVar184._12_4_ = local_320;
        auVar184._16_4_ = local_320;
        auVar184._20_4_ = local_320;
        auVar184._24_4_ = local_320;
        auVar184._28_4_ = local_320;
        auVar97 = vpor_avx2(auVar184,_DAT_01fb4ba0);
        auVar105 = vpcmpgtd_avx2(local_4c0,auVar97);
        auVar97 = auVar105 & auVar156;
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0x7f,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar97 >> 0xbf,0) == '\0') &&
            (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar97[0x1f]) {
          auVar199 = ZEXT3264(auVar198);
          auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(
                                                  fVar203,CONCAT412(fVar203,CONCAT48(fVar203,
                                                  CONCAT44(fVar203,fVar203))))))));
        }
        else {
          local_4e0 = vandps_avx(auVar105,auVar156);
          auVar40._4_4_ = local_680._4_4_ * fVar192;
          auVar40._0_4_ = (float)local_680 * fVar191;
          auVar40._8_4_ = (float)uStack_678 * fVar66;
          auVar40._12_4_ = uStack_678._4_4_ * fVar67;
          auVar40._16_4_ = (float)uStack_670 * fVar68;
          auVar40._20_4_ = uStack_670._4_4_ * fVar69;
          auVar40._24_4_ = (float)uStack_668 * fVar70;
          auVar40._28_4_ = auVar156._28_4_;
          auVar147 = vfmadd213ps_fma(auVar7,local_580,auVar40);
          auVar147 = vfmadd213ps_fma(auVar119,local_3a0,ZEXT1632(auVar147));
          auVar147 = vfmadd213ps_fma(auVar103,local_6e0,ZEXT1632(auVar147));
          local_480._0_4_ = auVar74._0_4_;
          local_480._4_4_ = auVar74._4_4_;
          fStack_478 = auVar74._8_4_;
          fStack_474 = auVar74._12_4_;
          fStack_470 = auVar74._16_4_;
          fStack_46c = auVar74._20_4_;
          fStack_468 = auVar74._24_4_;
          auVar41._4_4_ = local_680._4_4_ * (float)local_480._4_4_;
          auVar41._0_4_ = (float)local_680 * (float)local_480._0_4_;
          auVar41._8_4_ = (float)uStack_678 * fStack_478;
          auVar41._12_4_ = uStack_678._4_4_ * fStack_474;
          auVar41._16_4_ = (float)uStack_670 * fStack_470;
          auVar41._20_4_ = uStack_670._4_4_ * fStack_46c;
          auVar41._24_4_ = (float)uStack_668 * fStack_468;
          auVar41._28_4_ = auVar156._28_4_;
          auVar92 = vfmadd213ps_fma(auVar160,local_580,auVar41);
          auVar92 = vfmadd213ps_fma(auVar197,local_3a0,ZEXT1632(auVar92));
          auVar197 = *(undefined1 (*) [32])(lVar87 + 0x2200d38 + lVar86 * 4);
          auVar160 = *(undefined1 (*) [32])(lVar87 + 0x22011bc + lVar86 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar87 + 0x2201640 + lVar86 * 4);
          pfVar3 = (float *)(lVar87 + 0x2201ac4 + lVar86 * 4);
          fVar125 = *pfVar3;
          fVar124 = pfVar3[1];
          fVar106 = pfVar3[2];
          fVar107 = pfVar3[3];
          fVar108 = pfVar3[4];
          fVar109 = pfVar3[5];
          fVar110 = pfVar3[6];
          auVar176._0_4_ = fVar125 * fVar203;
          auVar176._4_4_ = fVar124 * fVar203;
          auVar176._8_4_ = fVar106 * fVar203;
          auVar176._12_4_ = fVar107 * fVar203;
          auVar176._16_4_ = fVar108 * fVar203;
          auVar176._20_4_ = fVar109 * fVar203;
          auVar176._24_4_ = fVar110 * fVar203;
          auVar176._28_4_ = 0;
          auVar205._0_4_ = fVar125 * fVar140;
          auVar205._4_4_ = fVar124 * fVar144;
          auVar205._8_4_ = fVar106 * fVar140;
          auVar205._12_4_ = fVar107 * fVar144;
          auVar205._16_4_ = fVar108 * fVar140;
          auVar205._20_4_ = fVar109 * fVar144;
          auVar205._24_4_ = fVar110 * fVar140;
          auVar205._28_4_ = 0;
          auVar42._4_4_ = fVar124 * local_680._4_4_;
          auVar42._0_4_ = fVar125 * (float)local_680;
          auVar42._8_4_ = fVar106 * (float)uStack_678;
          auVar42._12_4_ = fVar107 * uStack_678._4_4_;
          auVar42._16_4_ = fVar108 * (float)uStack_670;
          auVar42._20_4_ = fVar109 * uStack_670._4_4_;
          auVar42._24_4_ = fVar110 * (float)uStack_668;
          auVar42._28_4_ = pfVar3[7];
          auVar91 = vfmadd231ps_fma(auVar176,auVar103,auVar132);
          auVar113 = vfmadd231ps_fma(auVar205,auVar103,auVar182);
          auVar126 = vfmadd231ps_fma(auVar42,local_580,auVar103);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar160,auVar194);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar160,local_440);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_3a0,auVar160);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar197,auVar214);
          auVar113 = vfmadd231ps_fma(ZEXT1632(auVar113),auVar197,local_5c0);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_6e0,auVar197);
          pfVar3 = (float *)(lVar87 + 0x2203ee4 + lVar86 * 4);
          fVar125 = *pfVar3;
          fVar124 = pfVar3[1];
          fVar106 = pfVar3[2];
          fVar107 = pfVar3[3];
          fVar108 = pfVar3[4];
          fVar109 = pfVar3[5];
          fVar110 = pfVar3[6];
          auVar43._4_4_ = fVar203 * fVar124;
          auVar43._0_4_ = fVar203 * fVar125;
          auVar43._8_4_ = fVar203 * fVar106;
          auVar43._12_4_ = fVar203 * fVar107;
          auVar43._16_4_ = fVar203 * fVar108;
          auVar43._20_4_ = fVar203 * fVar109;
          auVar43._24_4_ = fVar203 * fVar110;
          auVar43._28_4_ = uVar78;
          auVar44._4_4_ = fVar144 * fVar124;
          auVar44._0_4_ = fVar140 * fVar125;
          auVar44._8_4_ = fVar140 * fVar106;
          auVar44._12_4_ = fVar144 * fVar107;
          auVar44._16_4_ = fVar140 * fVar108;
          auVar44._20_4_ = fVar144 * fVar109;
          auVar44._24_4_ = fVar140 * fVar110;
          auVar44._28_4_ = local_6e0._28_4_;
          auVar45._4_4_ = fVar124 * local_680._4_4_;
          auVar45._0_4_ = fVar125 * (float)local_680;
          auVar45._8_4_ = fVar106 * (float)uStack_678;
          auVar45._12_4_ = fVar107 * uStack_678._4_4_;
          auVar45._16_4_ = fVar108 * (float)uStack_670;
          auVar45._20_4_ = fVar109 * uStack_670._4_4_;
          auVar45._24_4_ = fVar110 * (float)uStack_668;
          auVar45._28_4_ = pfVar3[7];
          auVar197 = *(undefined1 (*) [32])(lVar87 + 0x2203a60 + lVar86 * 4);
          auVar90 = vfmadd231ps_fma(auVar43,auVar197,auVar132);
          auVar114 = vfmadd231ps_fma(auVar44,auVar197,auVar182);
          auVar141 = vfmadd231ps_fma(auVar45,local_580,auVar197);
          auVar197 = *(undefined1 (*) [32])(lVar87 + 0x22035dc + lVar86 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar197,auVar194);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar197,local_440);
          auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),auVar197,local_3a0);
          auVar197 = *(undefined1 (*) [32])(lVar87 + 0x2203158 + lVar86 * 4);
          auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar197,auVar214);
          auVar114 = vfmadd231ps_fma(ZEXT1632(auVar114),auVar197,local_5c0);
          auVar141 = vfmadd231ps_fma(ZEXT1632(auVar141),local_6e0,auVar197);
          auVar185._8_4_ = 0x7fffffff;
          auVar185._0_8_ = 0x7fffffff7fffffff;
          auVar185._12_4_ = 0x7fffffff;
          auVar185._16_4_ = 0x7fffffff;
          auVar185._20_4_ = 0x7fffffff;
          auVar185._24_4_ = 0x7fffffff;
          auVar185._28_4_ = 0x7fffffff;
          auVar197 = vandps_avx(ZEXT1632(auVar91),auVar185);
          auVar160 = vandps_avx(ZEXT1632(auVar113),auVar185);
          auVar160 = vmaxps_avx(auVar197,auVar160);
          auVar197 = vandps_avx(ZEXT1632(auVar126),auVar185);
          auVar197 = vmaxps_avx(auVar160,auVar197);
          auVar197 = vcmpps_avx(auVar197,_local_500,1);
          auVar103 = vblendvps_avx(ZEXT1632(auVar91),local_4a0,auVar197);
          auVar119 = vblendvps_avx(ZEXT1632(auVar113),local_5a0,auVar197);
          auVar197 = vandps_avx(ZEXT1632(auVar90),auVar185);
          auVar160 = vandps_avx(ZEXT1632(auVar114),auVar185);
          auVar160 = vmaxps_avx(auVar197,auVar160);
          auVar197 = vandps_avx(auVar185,ZEXT1632(auVar141));
          auVar197 = vmaxps_avx(auVar160,auVar197);
          auVar160 = vcmpps_avx(auVar197,_local_500,1);
          auVar197 = vblendvps_avx(ZEXT1632(auVar90),local_4a0,auVar160);
          auVar160 = vblendvps_avx(ZEXT1632(auVar114),local_5a0,auVar160);
          auVar92 = vfmadd213ps_fma(auVar96,local_6e0,ZEXT1632(auVar92));
          auVar91 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar119,auVar119);
          auVar96 = vrsqrtps_avx(ZEXT1632(auVar91));
          fVar125 = auVar96._0_4_;
          fVar124 = auVar96._4_4_;
          fVar106 = auVar96._8_4_;
          fVar107 = auVar96._12_4_;
          fVar108 = auVar96._16_4_;
          fVar109 = auVar96._20_4_;
          fVar110 = auVar96._24_4_;
          auVar46._4_4_ = fVar124 * fVar124 * fVar124 * auVar91._4_4_ * -0.5;
          auVar46._0_4_ = fVar125 * fVar125 * fVar125 * auVar91._0_4_ * -0.5;
          auVar46._8_4_ = fVar106 * fVar106 * fVar106 * auVar91._8_4_ * -0.5;
          auVar46._12_4_ = fVar107 * fVar107 * fVar107 * auVar91._12_4_ * -0.5;
          auVar46._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar46._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar46._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar46._28_4_ = 0;
          auVar216._8_4_ = 0x3fc00000;
          auVar216._0_8_ = 0x3fc000003fc00000;
          auVar216._12_4_ = 0x3fc00000;
          auVar216._16_4_ = 0x3fc00000;
          auVar216._20_4_ = 0x3fc00000;
          auVar216._24_4_ = 0x3fc00000;
          auVar216._28_4_ = 0x3fc00000;
          auVar91 = vfmadd231ps_fma(auVar46,auVar216,auVar96);
          fVar125 = auVar91._0_4_;
          fVar124 = auVar91._4_4_;
          auVar47._4_4_ = auVar119._4_4_ * fVar124;
          auVar47._0_4_ = auVar119._0_4_ * fVar125;
          fVar106 = auVar91._8_4_;
          auVar47._8_4_ = auVar119._8_4_ * fVar106;
          fVar107 = auVar91._12_4_;
          auVar47._12_4_ = auVar119._12_4_ * fVar107;
          auVar47._16_4_ = auVar119._16_4_ * 0.0;
          auVar47._20_4_ = auVar119._20_4_ * 0.0;
          auVar47._24_4_ = auVar119._24_4_ * 0.0;
          auVar47._28_4_ = auVar96._28_4_;
          auVar48._4_4_ = fVar124 * -auVar103._4_4_;
          auVar48._0_4_ = fVar125 * -auVar103._0_4_;
          auVar48._8_4_ = fVar106 * -auVar103._8_4_;
          auVar48._12_4_ = fVar107 * -auVar103._12_4_;
          auVar48._16_4_ = -auVar103._16_4_ * 0.0;
          auVar48._20_4_ = -auVar103._20_4_ * 0.0;
          auVar48._24_4_ = -auVar103._24_4_ * 0.0;
          auVar48._28_4_ = auVar119._28_4_;
          auVar91 = vfmadd213ps_fma(auVar197,auVar197,ZEXT832(0) << 0x20);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar160,auVar160);
          auVar96 = vrsqrtps_avx(ZEXT1632(auVar91));
          auVar49._28_4_ = fVar144;
          auVar49._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
          fVar125 = auVar96._0_4_;
          fVar124 = auVar96._4_4_;
          fVar106 = auVar96._8_4_;
          fVar107 = auVar96._12_4_;
          fVar108 = auVar96._16_4_;
          fVar109 = auVar96._20_4_;
          fVar110 = auVar96._24_4_;
          auVar50._4_4_ = fVar124 * fVar124 * fVar124 * auVar91._4_4_ * -0.5;
          auVar50._0_4_ = fVar125 * fVar125 * fVar125 * auVar91._0_4_ * -0.5;
          auVar50._8_4_ = fVar106 * fVar106 * fVar106 * auVar91._8_4_ * -0.5;
          auVar50._12_4_ = fVar107 * fVar107 * fVar107 * auVar91._12_4_ * -0.5;
          auVar50._16_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar50._20_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar50._24_4_ = fVar110 * fVar110 * fVar110 * -0.0;
          auVar50._28_4_ = 0;
          auVar91 = vfmadd231ps_fma(auVar50,auVar216,auVar96);
          fVar125 = auVar91._0_4_;
          fVar124 = auVar91._4_4_;
          auVar51._4_4_ = auVar160._4_4_ * fVar124;
          auVar51._0_4_ = auVar160._0_4_ * fVar125;
          fVar106 = auVar91._8_4_;
          auVar51._8_4_ = auVar160._8_4_ * fVar106;
          fVar107 = auVar91._12_4_;
          auVar51._12_4_ = auVar160._12_4_ * fVar107;
          auVar51._16_4_ = auVar160._16_4_ * 0.0;
          auVar51._20_4_ = auVar160._20_4_ * 0.0;
          auVar51._24_4_ = auVar160._24_4_ * 0.0;
          auVar51._28_4_ = 0;
          auVar52._4_4_ = fVar124 * -auVar197._4_4_;
          auVar52._0_4_ = fVar125 * -auVar197._0_4_;
          auVar52._8_4_ = fVar106 * -auVar197._8_4_;
          auVar52._12_4_ = fVar107 * -auVar197._12_4_;
          auVar52._16_4_ = -auVar197._16_4_ * 0.0;
          auVar52._20_4_ = -auVar197._20_4_ * 0.0;
          auVar52._24_4_ = -auVar197._24_4_ * 0.0;
          auVar52._28_4_ = auVar96._28_4_;
          auVar53._28_4_ = 0xbf000000;
          auVar53._0_28_ =
               ZEXT1628(CONCAT412(fVar107 * 0.0,
                                  CONCAT48(fVar106 * 0.0,CONCAT44(fVar124 * 0.0,fVar125 * 0.0))));
          auVar91 = vfmadd213ps_fma(auVar47,auVar211,local_6c0);
          auVar113 = vfmadd213ps_fma(auVar48,auVar211,auVar136);
          auVar126 = vfmadd213ps_fma(auVar49,auVar211,ZEXT1632(auVar92));
          auVar141 = vfnmadd213ps_fma(auVar47,auVar211,local_6c0);
          auVar90 = vfmadd213ps_fma(auVar51,ZEXT1632(auVar15),local_460);
          auVar145 = vfnmadd213ps_fma(auVar48,auVar211,auVar136);
          auVar121 = ZEXT1632(auVar15);
          auVar15 = vfmadd213ps_fma(auVar52,auVar121,local_660);
          auVar155 = vfnmadd231ps_fma(ZEXT1632(auVar92),auVar211,auVar49);
          auVar92 = vfmadd213ps_fma(auVar53,auVar121,ZEXT1632(auVar147));
          auVar89 = vfnmadd213ps_fma(auVar51,auVar121,local_460);
          auVar112 = vfnmadd213ps_fma(auVar52,auVar121,local_660);
          auVar161 = vfnmadd231ps_fma(ZEXT1632(auVar147),auVar121,auVar53);
          auVar96 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar145));
          auVar197 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar155));
          auVar54._4_4_ = auVar96._4_4_ * auVar155._4_4_;
          auVar54._0_4_ = auVar96._0_4_ * auVar155._0_4_;
          auVar54._8_4_ = auVar96._8_4_ * auVar155._8_4_;
          auVar54._12_4_ = auVar96._12_4_ * auVar155._12_4_;
          auVar54._16_4_ = auVar96._16_4_ * 0.0;
          auVar54._20_4_ = auVar96._20_4_ * 0.0;
          auVar54._24_4_ = auVar96._24_4_ * 0.0;
          auVar54._28_4_ = 0;
          auVar114 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar145),auVar197);
          auVar55._4_4_ = auVar141._4_4_ * auVar197._4_4_;
          auVar55._0_4_ = auVar141._0_4_ * auVar197._0_4_;
          auVar55._8_4_ = auVar141._8_4_ * auVar197._8_4_;
          auVar55._12_4_ = auVar141._12_4_ * auVar197._12_4_;
          auVar55._16_4_ = auVar197._16_4_ * 0.0;
          auVar55._20_4_ = auVar197._20_4_ * 0.0;
          auVar55._24_4_ = auVar197._24_4_ * 0.0;
          auVar55._28_4_ = auVar197._28_4_;
          auVar156 = ZEXT1632(auVar141);
          auVar197 = vsubps_avx(ZEXT1632(auVar90),auVar156);
          auVar105 = ZEXT1632(auVar155);
          auVar147 = vfmsub231ps_fma(auVar55,auVar105,auVar197);
          auVar56._4_4_ = auVar145._4_4_ * auVar197._4_4_;
          auVar56._0_4_ = auVar145._0_4_ * auVar197._0_4_;
          auVar56._8_4_ = auVar145._8_4_ * auVar197._8_4_;
          auVar56._12_4_ = auVar145._12_4_ * auVar197._12_4_;
          auVar56._16_4_ = auVar197._16_4_ * 0.0;
          auVar56._20_4_ = auVar197._20_4_ * 0.0;
          auVar56._24_4_ = auVar197._24_4_ * 0.0;
          auVar56._28_4_ = auVar197._28_4_;
          auVar141 = vfmsub231ps_fma(auVar56,auVar156,auVar96);
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar141),ZEXT832(0) << 0x20,ZEXT1632(auVar147));
          auVar147 = vfmadd231ps_fma(ZEXT1632(auVar147),ZEXT832(0) << 0x20,ZEXT1632(auVar114));
          auVar136 = vcmpps_avx(ZEXT1632(auVar147),ZEXT832(0) << 0x20,2);
          auVar96 = vblendvps_avx(ZEXT1632(auVar89),ZEXT1632(auVar91),auVar136);
          auVar197 = vblendvps_avx(ZEXT1632(auVar112),ZEXT1632(auVar113),auVar136);
          auVar160 = vblendvps_avx(ZEXT1632(auVar161),ZEXT1632(auVar126),auVar136);
          auVar103 = vblendvps_avx(auVar156,ZEXT1632(auVar90),auVar136);
          auVar119 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar15),auVar136);
          auVar7 = vblendvps_avx(auVar105,ZEXT1632(auVar92),auVar136);
          auVar156 = vblendvps_avx(ZEXT1632(auVar90),auVar156,auVar136);
          auVar97 = vblendvps_avx(ZEXT1632(auVar15),ZEXT1632(auVar145),auVar136);
          auVar147 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
          auVar105 = vblendvps_avx(ZEXT1632(auVar92),auVar105,auVar136);
          auVar156 = vsubps_avx(auVar156,auVar96);
          auVar97 = vsubps_avx(auVar97,auVar197);
          auVar17 = vsubps_avx(auVar105,auVar160);
          auVar98 = vsubps_avx(auVar96,auVar103);
          auVar115 = vsubps_avx(auVar197,auVar119);
          auVar210 = vsubps_avx(auVar160,auVar7);
          auVar157._0_4_ = auVar17._0_4_ * auVar96._0_4_;
          auVar157._4_4_ = auVar17._4_4_ * auVar96._4_4_;
          auVar157._8_4_ = auVar17._8_4_ * auVar96._8_4_;
          auVar157._12_4_ = auVar17._12_4_ * auVar96._12_4_;
          auVar157._16_4_ = auVar17._16_4_ * auVar96._16_4_;
          auVar157._20_4_ = auVar17._20_4_ * auVar96._20_4_;
          auVar157._24_4_ = auVar17._24_4_ * auVar96._24_4_;
          auVar157._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar157,auVar160,auVar156);
          auVar57._4_4_ = auVar156._4_4_ * auVar197._4_4_;
          auVar57._0_4_ = auVar156._0_4_ * auVar197._0_4_;
          auVar57._8_4_ = auVar156._8_4_ * auVar197._8_4_;
          auVar57._12_4_ = auVar156._12_4_ * auVar197._12_4_;
          auVar57._16_4_ = auVar156._16_4_ * auVar197._16_4_;
          auVar57._20_4_ = auVar156._20_4_ * auVar197._20_4_;
          auVar57._24_4_ = auVar156._24_4_ * auVar197._24_4_;
          auVar57._28_4_ = auVar105._28_4_;
          auVar92 = vfmsub231ps_fma(auVar57,auVar96,auVar97);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar92),ZEXT1632(auVar15),_DAT_01f7b000);
          auVar158._0_4_ = auVar97._0_4_ * auVar160._0_4_;
          auVar158._4_4_ = auVar97._4_4_ * auVar160._4_4_;
          auVar158._8_4_ = auVar97._8_4_ * auVar160._8_4_;
          auVar158._12_4_ = auVar97._12_4_ * auVar160._12_4_;
          auVar158._16_4_ = auVar97._16_4_ * auVar160._16_4_;
          auVar158._20_4_ = auVar97._20_4_ * auVar160._20_4_;
          auVar158._24_4_ = auVar97._24_4_ * auVar160._24_4_;
          auVar158._28_4_ = 0;
          auVar92 = vfmsub231ps_fma(auVar158,auVar197,auVar17);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar92));
          auVar139 = ZEXT1664(auVar92);
          auVar159._0_4_ = auVar210._0_4_ * auVar103._0_4_;
          auVar159._4_4_ = auVar210._4_4_ * auVar103._4_4_;
          auVar159._8_4_ = auVar210._8_4_ * auVar103._8_4_;
          auVar159._12_4_ = auVar210._12_4_ * auVar103._12_4_;
          auVar159._16_4_ = auVar210._16_4_ * auVar103._16_4_;
          auVar159._20_4_ = auVar210._20_4_ * auVar103._20_4_;
          auVar159._24_4_ = auVar210._24_4_ * auVar103._24_4_;
          auVar159._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar159,auVar98,auVar7);
          auVar58._4_4_ = auVar115._4_4_ * auVar7._4_4_;
          auVar58._0_4_ = auVar115._0_4_ * auVar7._0_4_;
          auVar58._8_4_ = auVar115._8_4_ * auVar7._8_4_;
          auVar58._12_4_ = auVar115._12_4_ * auVar7._12_4_;
          auVar58._16_4_ = auVar115._16_4_ * auVar7._16_4_;
          auVar58._20_4_ = auVar115._20_4_ * auVar7._20_4_;
          auVar58._24_4_ = auVar115._24_4_ * auVar7._24_4_;
          auVar58._28_4_ = auVar7._28_4_;
          auVar91 = vfmsub231ps_fma(auVar58,auVar119,auVar210);
          auVar59._4_4_ = auVar98._4_4_ * auVar119._4_4_;
          auVar59._0_4_ = auVar98._0_4_ * auVar119._0_4_;
          auVar59._8_4_ = auVar98._8_4_ * auVar119._8_4_;
          auVar59._12_4_ = auVar98._12_4_ * auVar119._12_4_;
          auVar59._16_4_ = auVar98._16_4_ * auVar119._16_4_;
          auVar59._20_4_ = auVar98._20_4_ * auVar119._20_4_;
          auVar59._24_4_ = auVar98._24_4_ * auVar119._24_4_;
          auVar59._28_4_ = auVar119._28_4_;
          auVar113 = vfmsub231ps_fma(auVar59,auVar115,auVar103);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar113),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar91));
          auVar103 = vmaxps_avx(ZEXT1632(auVar92),ZEXT1632(auVar91));
          auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
          auVar15 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          auVar147 = vpand_avx(auVar15,auVar147);
          auVar103 = vpmovsxwd_avx2(auVar147);
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
            auVar96 = vpcmpeqd_avx2(auVar156,auVar156);
LAB_0112d617:
            auVar202 = ZEXT3264(auVar202._0_32_);
            auVar199 = ZEXT3264(auVar198);
            auVar186 = ZEXT3264(auVar96);
            auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                          CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
          }
          else {
            auVar60._4_4_ = auVar97._4_4_ * auVar210._4_4_;
            auVar60._0_4_ = auVar97._0_4_ * auVar210._0_4_;
            auVar60._8_4_ = auVar97._8_4_ * auVar210._8_4_;
            auVar60._12_4_ = auVar97._12_4_ * auVar210._12_4_;
            auVar60._16_4_ = auVar97._16_4_ * auVar210._16_4_;
            auVar60._20_4_ = auVar97._20_4_ * auVar210._20_4_;
            auVar60._24_4_ = auVar97._24_4_ * auVar210._24_4_;
            auVar60._28_4_ = auVar103._28_4_;
            auVar90 = vfmsub231ps_fma(auVar60,auVar115,auVar17);
            auVar167._0_4_ = auVar17._0_4_ * auVar98._0_4_;
            auVar167._4_4_ = auVar17._4_4_ * auVar98._4_4_;
            auVar167._8_4_ = auVar17._8_4_ * auVar98._8_4_;
            auVar167._12_4_ = auVar17._12_4_ * auVar98._12_4_;
            auVar167._16_4_ = auVar17._16_4_ * auVar98._16_4_;
            auVar167._20_4_ = auVar17._20_4_ * auVar98._20_4_;
            auVar167._24_4_ = auVar17._24_4_ * auVar98._24_4_;
            auVar167._28_4_ = 0;
            auVar126 = vfmsub231ps_fma(auVar167,auVar156,auVar210);
            auVar61._4_4_ = auVar156._4_4_ * auVar115._4_4_;
            auVar61._0_4_ = auVar156._0_4_ * auVar115._0_4_;
            auVar61._8_4_ = auVar156._8_4_ * auVar115._8_4_;
            auVar61._12_4_ = auVar156._12_4_ * auVar115._12_4_;
            auVar61._16_4_ = auVar156._16_4_ * auVar115._16_4_;
            auVar61._20_4_ = auVar156._20_4_ * auVar115._20_4_;
            auVar61._24_4_ = auVar156._24_4_ * auVar115._24_4_;
            auVar61._28_4_ = auVar115._28_4_;
            auVar114 = vfmsub231ps_fma(auVar61,auVar98,auVar97);
            auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar126),ZEXT1632(auVar114));
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar90),ZEXT832(0) << 0x20);
            auVar103 = vrcpps_avx(ZEXT1632(auVar113));
            auVar206._8_4_ = 0x3f800000;
            auVar206._0_8_ = 0x3f8000003f800000;
            auVar206._12_4_ = 0x3f800000;
            auVar206._16_4_ = 0x3f800000;
            auVar206._20_4_ = 0x3f800000;
            auVar206._24_4_ = 0x3f800000;
            auVar206._28_4_ = 0x3f800000;
            auVar15 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar113),auVar206);
            auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar103,auVar103);
            auVar142._0_4_ = auVar114._0_4_ * auVar160._0_4_;
            auVar142._4_4_ = auVar114._4_4_ * auVar160._4_4_;
            auVar142._8_4_ = auVar114._8_4_ * auVar160._8_4_;
            auVar142._12_4_ = auVar114._12_4_ * auVar160._12_4_;
            auVar142._16_4_ = auVar160._16_4_ * 0.0;
            auVar142._20_4_ = auVar160._20_4_ * 0.0;
            auVar142._24_4_ = auVar160._24_4_ * 0.0;
            auVar142._28_4_ = 0;
            auVar126 = vfmadd231ps_fma(auVar142,ZEXT1632(auVar126),auVar197);
            auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar96,ZEXT1632(auVar90));
            fVar125 = auVar15._0_4_;
            fVar124 = auVar15._4_4_;
            fVar106 = auVar15._8_4_;
            fVar107 = auVar15._12_4_;
            auVar160 = ZEXT1632(CONCAT412(fVar107 * auVar126._12_4_,
                                          CONCAT48(fVar106 * auVar126._8_4_,
                                                   CONCAT44(fVar124 * auVar126._4_4_,
                                                            fVar125 * auVar126._0_4_))));
            uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar143._4_4_ = uVar78;
            auVar143._0_4_ = uVar78;
            auVar143._8_4_ = uVar78;
            auVar143._12_4_ = uVar78;
            auVar143._16_4_ = uVar78;
            auVar143._20_4_ = uVar78;
            auVar143._24_4_ = uVar78;
            auVar143._28_4_ = uVar78;
            auVar73._4_4_ = uStack_5dc;
            auVar73._0_4_ = local_5e0;
            auVar73._8_4_ = uStack_5d8;
            auVar73._12_4_ = uStack_5d4;
            auVar73._16_4_ = uStack_5d0;
            auVar73._20_4_ = uStack_5cc;
            auVar73._24_4_ = uStack_5c8;
            auVar73._28_4_ = uStack_5c4;
            auVar96 = vcmpps_avx(auVar73,auVar160,2);
            auVar197 = vcmpps_avx(auVar160,auVar143,2);
            auVar96 = vandps_avx(auVar197,auVar96);
            auVar15 = vpackssdw_avx(auVar96._0_16_,auVar96._16_16_);
            auVar147 = vpand_avx(auVar147,auVar15);
            auVar96 = vpmovsxwd_avx2(auVar147);
            auVar197 = ZEXT1632(auVar113);
            if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar96 >> 0x7f,0) == '\0') &&
                  (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0xbf,0) == '\0') &&
                (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar96[0x1f]) {
              auVar96 = vpcmpeqd_avx2(auVar197,auVar197);
              goto LAB_0112d617;
            }
            auVar96 = vcmpps_avx(auVar197,ZEXT832(0) << 0x20,4);
            auVar113 = auVar96._16_16_;
            auVar15 = vpackssdw_avx(auVar96._0_16_,auVar113);
            auVar147 = vpand_avx(auVar147,auVar15);
            auVar197 = vpmovsxwd_avx2(auVar147);
            auVar173 = ZEXT3264(CONCAT824(uStack_5e8,
                                          CONCAT816(uStack_5f0,CONCAT88(uStack_5f8,local_600))));
            auVar96 = vpcmpeqd_avx2(ZEXT1632(auVar113),ZEXT1632(auVar113));
            auVar186 = ZEXT3264(auVar96);
            auVar202 = ZEXT3264(auVar202._0_32_);
            auVar199 = ZEXT3264(auVar198);
            if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar197 >> 0x7f,0) != '\0') ||
                  (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar197 >> 0xbf,0) != '\0') ||
                (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar197[0x1f] < '\0') {
              auVar103 = ZEXT1632(CONCAT412(fVar107 * auVar92._12_4_,
                                            CONCAT48(fVar106 * auVar92._8_4_,
                                                     CONCAT44(fVar124 * auVar92._4_4_,
                                                              fVar125 * auVar92._0_4_))));
              auVar62._28_4_ = SUB84(uStack_5e8,4);
              auVar62._0_28_ =
                   ZEXT1628(CONCAT412(fVar107 * auVar91._12_4_,
                                      CONCAT48(fVar106 * auVar91._8_4_,
                                               CONCAT44(fVar124 * auVar91._4_4_,
                                                        fVar125 * auVar91._0_4_))));
              auVar177._8_4_ = 0x3f800000;
              auVar177._0_8_ = 0x3f8000003f800000;
              auVar177._12_4_ = 0x3f800000;
              auVar177._16_4_ = 0x3f800000;
              auVar177._20_4_ = 0x3f800000;
              auVar177._24_4_ = 0x3f800000;
              auVar177._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar177,auVar103);
              auVar96 = vblendvps_avx(auVar96,auVar103,auVar136);
              auVar202 = ZEXT3264(auVar96);
              auVar96 = vsubps_avx(auVar177,auVar62);
              local_540 = vblendvps_avx(auVar96,auVar62,auVar136);
              auVar139 = ZEXT3264(local_540);
              auVar173 = ZEXT3264(auVar197);
              auVar199 = ZEXT3264(auVar160);
            }
          }
          auVar96 = auVar173._0_32_;
          if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar96 >> 0x7f,0) == '\0') &&
                (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar96 >> 0xbf,0) == '\0') &&
              (auVar173 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar173[0x1f]) {
            auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(
                                                  fVar203,CONCAT412(fVar203,CONCAT48(fVar203,
                                                  CONCAT44(fVar203,fVar203))))))));
          }
          else {
            auVar197 = vsubps_avx(auVar121,auVar211);
            auVar103 = auVar202._0_32_;
            auVar147 = vfmadd213ps_fma(auVar197,auVar103,auVar211);
            fVar125 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
            auVar63._4_4_ = (auVar147._4_4_ + auVar147._4_4_) * fVar125;
            auVar63._0_4_ = (auVar147._0_4_ + auVar147._0_4_) * fVar125;
            auVar63._8_4_ = (auVar147._8_4_ + auVar147._8_4_) * fVar125;
            auVar63._12_4_ = (auVar147._12_4_ + auVar147._12_4_) * fVar125;
            auVar63._16_4_ = fVar125 * 0.0;
            auVar63._20_4_ = fVar125 * 0.0;
            auVar63._24_4_ = fVar125 * 0.0;
            auVar63._28_4_ = fVar125;
            local_6a0 = auVar199._0_32_;
            auVar197 = vcmpps_avx(local_6a0,auVar63,6);
            auVar160 = auVar96 & auVar197;
            auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,CONCAT416(
                                                  fVar203,CONCAT412(fVar203,CONCAT48(fVar203,
                                                  CONCAT44(fVar203,fVar203))))))));
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0x7f,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0xbf,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar160[0x1f] < '\0') {
              auVar122._8_4_ = 0xbf800000;
              auVar122._0_8_ = 0xbf800000bf800000;
              auVar122._12_4_ = 0xbf800000;
              auVar122._16_4_ = 0xbf800000;
              auVar122._20_4_ = 0xbf800000;
              auVar122._24_4_ = 0xbf800000;
              auVar122._28_4_ = 0xbf800000;
              auVar137._8_4_ = 0x40000000;
              auVar137._0_8_ = 0x4000000040000000;
              auVar137._12_4_ = 0x40000000;
              auVar137._16_4_ = 0x40000000;
              auVar137._20_4_ = 0x40000000;
              auVar137._24_4_ = 0x40000000;
              auVar137._28_4_ = 0x40000000;
              auVar139 = ZEXT3264(auVar137);
              auVar147 = vfmadd213ps_fma(local_540,auVar137,auVar122);
              local_360 = ZEXT1632(auVar147);
              local_300 = local_730;
              uStack_2f8 = uStack_728;
              local_2f0 = local_740;
              uStack_2e8 = uStack_738;
              pGVar9 = (context->scene->geometries).items[uVar83].ptr;
              local_540 = local_360;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                pRVar81 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar81 = context->args;
                if ((pRVar81->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar81 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar81 >> 8),1),
                   pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_6c0 = ZEXT1632(CONCAT124(auVar150._4_12_,(int)uVar82));
                  auVar96 = vandps_avx(auVar197,auVar96);
                  fVar125 = (float)local_320;
                  auVar139 = ZEXT3264(CONCAT428(fVar125,CONCAT424(fVar125,CONCAT420(fVar125,
                                                  CONCAT416(fVar125,CONCAT412(fVar125,CONCAT48(
                                                  fVar125,CONCAT44(fVar125,fVar125))))))));
                  local_2a0[0] = (fVar125 + auVar202._0_4_ + 0.0) * local_120;
                  local_2a0[1] = (fVar125 + auVar202._4_4_ + 1.0) * fStack_11c;
                  local_2a0[2] = (fVar125 + auVar202._8_4_ + 2.0) * fStack_118;
                  local_2a0[3] = (fVar125 + auVar202._12_4_ + 3.0) * fStack_114;
                  fStack_290 = (fVar125 + auVar202._16_4_ + 4.0) * fStack_110;
                  fStack_28c = (fVar125 + auVar202._20_4_ + 5.0) * fStack_10c;
                  fStack_288 = (fVar125 + auVar202._24_4_ + 6.0) * fStack_108;
                  fStack_284 = fVar125 + auVar202._28_4_ + 7.0;
                  local_540._0_8_ = auVar147._0_8_;
                  local_540._8_8_ = auVar147._8_8_;
                  local_280 = local_540._0_8_;
                  uStack_278 = local_540._8_8_;
                  uStack_270 = 0;
                  uStack_268 = 0;
                  local_260 = local_6a0;
                  uVar78 = vmovmskps_avx(auVar96);
                  uVar82 = 0;
                  uVar84 = CONCAT44((int)((ulong)pRVar81 >> 0x20),uVar78);
                  for (uVar18 = uVar84; _local_480 = *pauVar2, local_380 = auVar103,
                      local_340 = local_6a0, local_31c = iVar77, local_310 = uVar71,
                      uStack_308 = uVar72, (uVar18 & 1) == 0;
                      uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                    uVar82 = uVar82 + 1;
                  }
                  while (auVar96 = auVar186._0_32_, uVar84 != 0) {
                    uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
                    fVar125 = local_2a0[uVar82];
                    auVar95._4_4_ = fVar125;
                    auVar95._0_4_ = fVar125;
                    auVar95._8_4_ = fVar125;
                    auVar95._12_4_ = fVar125;
                    local_1e0._16_4_ = fVar125;
                    local_1e0._0_16_ = auVar95;
                    local_1e0._20_4_ = fVar125;
                    local_1e0._24_4_ = fVar125;
                    local_1e0._28_4_ = fVar125;
                    local_1c0 = *(undefined4 *)((long)&local_280 + uVar82 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_260 + uVar82 * 4);
                    fVar106 = 1.0 - fVar125;
                    auVar150 = ZEXT416((uint)(fVar125 * fVar106 * 4.0));
                    auVar147 = vfnmsub213ss_fma(auVar95,auVar95,auVar150);
                    auVar150 = vfmadd213ss_fma(ZEXT416((uint)fVar106),ZEXT416((uint)fVar106),
                                               auVar150);
                    fVar124 = auVar150._0_4_ * 0.5;
                    fVar125 = fVar125 * fVar125 * 0.5;
                    auVar151._0_4_ = fVar125 * (float)local_620._0_4_;
                    auVar151._4_4_ = fVar125 * (float)local_620._4_4_;
                    auVar151._8_4_ = fVar125 * fStack_618;
                    auVar151._12_4_ = fVar125 * fStack_614;
                    auVar129._4_4_ = fVar124;
                    auVar129._0_4_ = fVar124;
                    auVar129._8_4_ = fVar124;
                    auVar129._12_4_ = fVar124;
                    auVar150 = vfmadd132ps_fma(auVar129,auVar151,auVar14);
                    fVar125 = auVar147._0_4_ * 0.5;
                    auVar152._4_4_ = fVar125;
                    auVar152._0_4_ = fVar125;
                    auVar152._8_4_ = fVar125;
                    auVar152._12_4_ = fVar125;
                    auVar150 = vfmadd132ps_fma(auVar152,auVar150,auVar13);
                    local_710.context = context->user;
                    fVar125 = fVar106 * -fVar106 * 0.5;
                    auVar130._4_4_ = fVar125;
                    auVar130._0_4_ = fVar125;
                    auVar130._8_4_ = fVar125;
                    auVar130._12_4_ = fVar125;
                    auVar147 = vfmadd132ps_fma(auVar130,auVar150,auVar12);
                    local_240 = auVar147._0_4_;
                    uStack_23c = local_240;
                    uStack_238 = local_240;
                    uStack_234 = local_240;
                    uStack_230 = local_240;
                    uStack_22c = local_240;
                    uStack_228 = local_240;
                    uStack_224 = local_240;
                    auVar150 = vmovshdup_avx(auVar147);
                    local_220 = auVar150._0_8_;
                    uStack_218 = local_220;
                    uStack_210 = local_220;
                    uStack_208 = local_220;
                    auVar150 = vshufps_avx(auVar147,auVar147,0xaa);
                    auVar131._0_8_ = auVar150._0_8_;
                    auVar131._8_8_ = auVar131._0_8_;
                    local_200._16_8_ = auVar131._0_8_;
                    local_200._0_16_ = auVar131;
                    local_200._24_8_ = auVar131._0_8_;
                    auVar139 = ZEXT3264(local_200);
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = CONCAT44(uStack_fc,local_100);
                    uStack_198 = CONCAT44(uStack_f4,uStack_f8);
                    uStack_190 = CONCAT44(uStack_ec,uStack_f0);
                    uStack_188 = CONCAT44(uStack_e4,uStack_e8);
                    local_180 = local_560;
                    uStack_178 = uStack_558;
                    uStack_170 = CONCAT44(uStack_54c,uStack_550);
                    uStack_168 = CONCAT44(uStack_544,uStack_548);
                    local_160 = (local_710.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_710.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_640 = local_400;
                    local_710.valid = (int *)local_640;
                    local_710.geometryUserPtr = pGVar9->userPtr;
                    local_710.hit = (RTCHitN *)&local_240;
                    local_710.N = 8;
                    local_710.ray = (RTCRayN *)ray;
                    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar139 = ZEXT1664(auVar131);
                      auVar96 = ZEXT1632(auVar186._0_16_);
                      (*pGVar9->occlusionFilterN)(&local_710);
                    }
                    auVar197 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar160 = vpcmpeqd_avx2(auVar96,auVar96);
                    auVar96 = auVar160 & ~auVar197;
                    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar96 >> 0x7f,0) == '\0') &&
                          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar96 >> 0xbf,0) == '\0') &&
                        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar96[0x1f]) {
                      auVar197 = auVar160 ^ auVar197;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar160 = ZEXT1632(auVar160._0_16_);
                        (*p_Var11)(&local_710);
                      }
                      auVar96 = vpcmpeqd_avx2(local_640,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                      auVar160 = vpcmpeqd_avx2(auVar160,auVar160);
                      auVar197 = auVar160 ^ auVar96;
                      auVar138._8_4_ = 0xff800000;
                      auVar138._0_8_ = 0xff800000ff800000;
                      auVar138._12_4_ = 0xff800000;
                      auVar138._16_4_ = 0xff800000;
                      auVar138._20_4_ = 0xff800000;
                      auVar138._24_4_ = 0xff800000;
                      auVar138._28_4_ = 0xff800000;
                      auVar139 = ZEXT3264(auVar138);
                      auVar96 = vblendvps_avx(auVar138,*(undefined1 (*) [32])(local_710.ray + 0x100)
                                              ,auVar96);
                      *(undefined1 (*) [32])(local_710.ray + 0x100) = auVar96;
                    }
                    auVar186 = ZEXT3264(auVar160);
                    if ((((((((auVar197 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar197 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar197 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar197 >> 0x7f,0) != '\0') ||
                          (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar197 >> 0xbf,0) != '\0') ||
                        (auVar197 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar197[0x1f] < '\0') {
                      pRVar81 = (RTCIntersectArguments *)0x1;
                      goto LAB_0112d634;
                    }
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar78;
                    uVar18 = uVar82 & 0x3f;
                    uVar82 = 0;
                    uVar84 = uVar84 ^ 1L << uVar18;
                    for (uVar18 = uVar84; (uVar18 & 1) == 0;
                        uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                      uVar82 = uVar82 + 1;
                    }
                  }
                  pRVar81 = (RTCIntersectArguments *)0x0;
LAB_0112d634:
                  auVar202 = ZEXT3264(auVar103);
                  auVar199 = ZEXT3264(local_6a0);
                  auVar173 = ZEXT3264(CONCAT428(fVar203,CONCAT424(fVar203,CONCAT420(fVar203,
                                                  CONCAT416(fVar203,CONCAT412(fVar203,CONCAT48(
                                                  fVar203,CONCAT44(fVar203,fVar203))))))));
                  uVar82 = (ulong)(uint)local_6c0._0_4_;
                }
              }
              uVar82 = CONCAT71((int7)(uVar82 >> 8),(byte)uVar82 | (byte)pRVar81);
            }
          }
        }
      }
    }
    if ((uVar82 & 1) != 0) break;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar93._4_4_ = uVar78;
    auVar93._0_4_ = uVar78;
    auVar93._8_4_ = uVar78;
    auVar93._12_4_ = uVar78;
    auVar150 = vcmpps_avx(local_420,auVar93,2);
    uVar83 = vmovmskps_avx(auVar150);
  }
  return local_608 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }